

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::sse2::CurveNiMBIntersector1<4>::
     occluded_n<embree::sse2::OrientedCurve1Intersector1<embree::BSplineCurveT,3,4>,embree::sse2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  Primitive *pPVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  Primitive PVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  Geometry *pGVar21;
  __int_type_conflict _Var22;
  long lVar23;
  long lVar24;
  long lVar25;
  bool bVar26;
  bool bVar27;
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined3 uVar34;
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined6 uVar77;
  undefined1 auVar78 [12];
  unkbyte9 Var79;
  undefined1 auVar80 [13];
  undefined1 auVar81 [12];
  undefined1 auVar82 [13];
  undefined1 auVar83 [12];
  undefined1 auVar84 [13];
  undefined1 auVar85 [12];
  undefined1 auVar86 [12];
  undefined1 auVar87 [12];
  undefined1 auVar88 [12];
  undefined1 auVar89 [13];
  undefined1 auVar90 [12];
  undefined1 auVar91 [13];
  undefined1 auVar92 [12];
  undefined1 auVar93 [12];
  undefined1 auVar94 [12];
  undefined1 auVar95 [12];
  undefined1 auVar96 [12];
  undefined1 auVar97 [12];
  undefined1 auVar98 [12];
  undefined1 auVar99 [15];
  undefined1 auVar100 [15];
  undefined1 auVar101 [15];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [15];
  undefined1 auVar105 [15];
  undefined1 auVar106 [15];
  undefined1 auVar107 [15];
  undefined1 auVar108 [15];
  undefined1 auVar109 [15];
  undefined1 auVar110 [15];
  undefined1 auVar111 [15];
  undefined1 auVar112 [15];
  undefined1 auVar113 [15];
  undefined1 auVar114 [15];
  undefined1 auVar115 [15];
  undefined1 auVar116 [15];
  undefined1 auVar117 [15];
  undefined1 auVar118 [15];
  undefined1 auVar119 [15];
  undefined1 auVar120 [15];
  undefined1 auVar121 [15];
  undefined1 auVar122 [13];
  undefined1 auVar123 [13];
  undefined1 auVar124 [13];
  undefined1 auVar125 [15];
  undefined1 auVar126 [15];
  undefined1 auVar127 [15];
  byte bVar128;
  ulong uVar129;
  ulong uVar130;
  RTCFilterFunctionN p_Var131;
  ulong uVar132;
  long lVar133;
  long lVar134;
  byte bVar135;
  bool bVar136;
  uint uVar137;
  uint uVar138;
  uint uVar139;
  uint uVar140;
  char cVar141;
  short sVar142;
  char cVar184;
  undefined1 uVar187;
  undefined2 uVar186;
  int iVar143;
  undefined1 auVar145 [12];
  undefined1 uVar185;
  int iVar188;
  vfloat_impl<4> p00;
  char cVar191;
  undefined1 auVar147 [16];
  undefined1 auVar150 [16];
  undefined1 auVar146 [12];
  undefined1 auVar154 [16];
  float fVar192;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar162 [16];
  undefined1 auVar165 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  float fVar209;
  float fVar210;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar211;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  undefined1 auVar208 [16];
  char cVar212;
  char cVar240;
  float t1;
  undefined1 auVar214 [12];
  float fVar241;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar219 [16];
  undefined1 auVar223 [16];
  undefined1 auVar226 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar213;
  float fVar242;
  float fVar243;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  float fVar244;
  char cVar251;
  float fVar252;
  float fVar253;
  float fVar255;
  undefined1 auVar245 [16];
  float fVar254;
  float fVar256;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  float fVar257;
  undefined1 auVar261 [12];
  float fVar304;
  vfloat4 a;
  float fVar258;
  float fVar259;
  undefined1 auVar267 [16];
  undefined1 auVar271 [16];
  float fVar306;
  undefined1 auVar275 [16];
  undefined1 auVar263 [12];
  undefined1 auVar279 [16];
  undefined1 auVar264 [12];
  undefined1 auVar283 [16];
  float fVar309;
  float fVar310;
  float fVar313;
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar265 [12];
  undefined1 auVar288 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  float fVar311;
  float fVar312;
  float fVar314;
  float fVar315;
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  float fVar316;
  undefined1 auVar317 [12];
  float fVar338;
  float fVar339;
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar318 [12];
  undefined1 auVar324 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  float fVar347;
  undefined1 auVar340 [12];
  undefined1 auVar341 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  float fVar348;
  float fVar356;
  float fVar357;
  float fVar358;
  float fVar359;
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  float fVar368;
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  float fVar369;
  float fVar380;
  float fVar383;
  undefined1 auVar372 [16];
  float fVar370;
  float fVar371;
  float fVar381;
  float fVar382;
  float fVar384;
  float fVar385;
  float fVar386;
  float fVar387;
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  float fVar388;
  float fVar389;
  float fVar390;
  float fVar396;
  float fVar400;
  vfloat4 a_1;
  float fVar397;
  float fVar398;
  float fVar399;
  float fVar401;
  float fVar402;
  float fVar403;
  float fVar404;
  float fVar405;
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  float fVar406;
  float fVar414;
  undefined8 uVar407;
  float fVar415;
  vfloat4 a_3;
  float fVar413;
  undefined1 auVar408 [16];
  float fVar416;
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  float fVar417;
  float fVar418;
  float fVar423;
  float fVar425;
  undefined1 auVar419 [16];
  float fVar424;
  float fVar426;
  float fVar427;
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  float fVar428;
  float fVar429;
  float fVar434;
  float fVar435;
  float fVar436;
  float fVar437;
  float fVar438;
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  float fVar439;
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  float fVar443;
  float fVar446;
  float fVar447;
  float fVar448;
  float fVar449;
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00_1;
  vfloat_impl<4> p02;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined8 local_418;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [6];
  undefined2 uStack_3f2;
  float fStack_3f0;
  float fStack_3ec;
  undefined4 local_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [6];
  undefined2 uStack_352;
  float fStack_350;
  float fStack_34c;
  undefined8 local_348;
  undefined8 uStack_340;
  float local_338;
  float fStack_334;
  undefined8 uStack_330;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined8 local_2a8;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  Primitive *local_290;
  RTCFilterFunctionNArguments local_288;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  uint auStack_208 [4];
  undefined8 local_1f8;
  float local_1f0;
  float local_1ec;
  float fStack_1e8;
  undefined4 local_1e4;
  uint local_1e0;
  uint local_1dc;
  uint local_1d8;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [16];
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [16];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float afStack_78 [8];
  float afStack_58 [10];
  undefined1 auVar144 [12];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar151 [16];
  undefined1 auVar155 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar156 [16];
  int iVar189;
  int iVar190;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar220 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar260 [12];
  undefined1 auVar262 [12];
  undefined1 auVar289 [16];
  undefined1 auVar268 [16];
  undefined1 auVar272 [16];
  undefined1 auVar276 [16];
  undefined1 auVar280 [16];
  undefined1 auVar284 [16];
  undefined1 auVar290 [16];
  undefined1 auVar266 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar285 [16];
  undefined1 auVar291 [16];
  int iVar305;
  int iVar307;
  int iVar308;
  undefined1 auVar321 [16];
  undefined1 auVar325 [16];
  undefined1 auVar322 [16];
  undefined1 auVar326 [16];
  undefined1 auVar323 [16];
  undefined1 auVar327 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  
  PVar13 = prim[1];
  uVar129 = (ulong)(byte)PVar13;
  lVar133 = uVar129 * 0x25;
  uVar5 = *(undefined4 *)(prim + uVar129 * 4 + 6);
  uVar14 = *(undefined4 *)(prim + uVar129 * 5 + 6);
  uVar15 = *(undefined4 *)(prim + uVar129 * 6 + 6);
  uVar6 = *(undefined4 *)(prim + uVar129 * 0xf + 6);
  uVar16 = *(undefined4 *)(prim + (ulong)(byte)PVar13 * 0x10 + 6);
  uVar17 = *(undefined4 *)(prim + uVar129 * 0x11 + 6);
  uVar18 = *(undefined4 *)(prim + uVar129 * 0x1a + 6);
  uVar19 = *(undefined4 *)(prim + uVar129 * 0x1b + 6);
  uVar20 = *(undefined4 *)(prim + uVar129 * 0x1c + 6);
  pPVar4 = prim + lVar133 + 6;
  fVar436 = *(float *)(pPVar4 + 0xc);
  fVar316 = ((ray->org).field_0.m128[0] - *(float *)pPVar4) * fVar436;
  fVar338 = ((ray->org).field_0.m128[1] - *(float *)(pPVar4 + 4)) * fVar436;
  fVar339 = ((ray->org).field_0.m128[2] - *(float *)(pPVar4 + 8)) * fVar436;
  fVar428 = fVar436 * (ray->dir).field_0.m128[0];
  fVar434 = fVar436 * (ray->dir).field_0.m128[1];
  fVar436 = fVar436 * (ray->dir).field_0.m128[2];
  uVar187 = (undefined1)((uint)uVar18 >> 0x18);
  uVar186 = CONCAT11((char)((uint)uVar14 >> 0x18),uVar187);
  uVar185 = (undefined1)((uint)uVar18 >> 0x10);
  uVar407 = CONCAT35(CONCAT21(uVar186,(char)((uint)uVar14 >> 0x10)),CONCAT14(uVar185,uVar18));
  cVar240 = (char)((uint)uVar14 >> 8);
  cVar184 = (char)((uint)uVar18 >> 8);
  uVar77 = CONCAT51(CONCAT41((int)((ulong)uVar407 >> 0x20),cVar240),cVar184);
  cVar141 = (char)uVar18;
  cVar212 = (char)uVar14;
  uVar130 = CONCAT62(uVar77,CONCAT11(cVar212,cVar141));
  auVar293._8_4_ = 0;
  auVar293._0_8_ = uVar130;
  auVar293._12_2_ = uVar186;
  auVar293._14_2_ = uVar186;
  uVar186 = (undefined2)((ulong)uVar407 >> 0x20);
  auVar158._12_4_ = auVar293._12_4_;
  auVar158._8_2_ = 0;
  auVar158._0_8_ = uVar130;
  auVar158._10_2_ = uVar186;
  auVar230._10_6_ = auVar158._10_6_;
  auVar230._8_2_ = uVar186;
  auVar230._0_8_ = uVar130;
  uVar186 = (undefined2)uVar77;
  auVar78._4_8_ = auVar230._8_8_;
  auVar78._2_2_ = uVar186;
  auVar78._0_2_ = uVar186;
  iVar143 = (int)CONCAT11(cVar212,cVar141) >> 8;
  iVar188 = auVar78._0_4_ >> 0x18;
  auVar144._0_8_ = CONCAT44(iVar188,iVar143);
  auVar144._8_4_ = auVar230._8_4_ >> 0x18;
  auVar232._12_4_ = auVar158._12_4_ >> 0x18;
  auVar232._0_12_ = auVar144;
  fVar368 = (float)iVar188;
  cVar191 = cVar240 >> 7;
  auVar37[0xd] = 0;
  auVar37._0_13_ = auVar232._0_13_;
  auVar37[0xe] = cVar191;
  auVar42[0xc] = cVar191;
  auVar42._0_12_ = auVar144;
  auVar42._13_2_ = auVar37._13_2_;
  auVar47[0xb] = 0;
  auVar47._0_11_ = auVar144._0_11_;
  auVar47._12_3_ = auVar42._12_3_;
  auVar52[10] = cVar191;
  auVar52._0_10_ = auVar144._0_10_;
  auVar52._11_4_ = auVar47._11_4_;
  auVar57[9] = 0;
  auVar57._0_9_ = auVar144._0_9_;
  auVar57._10_5_ = auVar52._10_5_;
  auVar62[8] = cVar240;
  auVar62._0_8_ = auVar144._0_8_;
  auVar62._9_6_ = auVar57._9_6_;
  Var79 = CONCAT81(CONCAT71(auVar62._8_7_,(char)((uint)uVar15 >> 0x18)),(short)cVar212 >> 7);
  auVar67._6_9_ = Var79;
  auVar67[5] = (char)((uint)uVar15 >> 0x10);
  auVar67[4] = (undefined1)((short)cVar212 >> 7);
  auVar67._0_4_ = iVar143;
  cVar251 = (char)((uint)uVar15 >> 8);
  auVar80._2_11_ = auVar67._4_11_;
  auVar80[1] = cVar251;
  auVar80[0] = (undefined1)((short)cVar212 >> 7);
  cVar240 = (char)uVar15;
  auVar72._2_13_ = auVar80;
  auVar72._0_2_ = CONCAT11(cVar240,cVar212);
  uVar186 = (undefined2)Var79;
  auVar148._0_12_ = auVar72._0_12_;
  auVar148._12_2_ = uVar186;
  auVar148._14_2_ = uVar186;
  auVar374._12_4_ = auVar148._12_4_;
  auVar374._0_10_ = auVar72._0_10_;
  auVar374._10_2_ = auVar67._4_2_;
  auVar147._10_6_ = auVar374._10_6_;
  auVar147._0_8_ = auVar72._0_8_;
  auVar147._8_2_ = auVar67._4_2_;
  auVar81._4_8_ = auVar147._8_8_;
  auVar81._2_2_ = auVar80._0_2_;
  auVar81._0_2_ = auVar80._0_2_;
  iVar188 = (int)CONCAT11(cVar240,cVar212) >> 8;
  iVar189 = auVar81._0_4_ >> 0x18;
  auVar145._0_8_ = CONCAT44(iVar189,iVar188);
  auVar145._8_4_ = auVar147._8_4_ >> 0x18;
  auVar149._12_4_ = auVar374._12_4_ >> 0x18;
  auVar149._0_12_ = auVar145;
  fVar396 = (float)iVar189;
  cVar191 = cVar251 >> 7;
  auVar38[0xd] = 0;
  auVar38._0_13_ = auVar149._0_13_;
  auVar38[0xe] = cVar191;
  auVar43[0xc] = cVar191;
  auVar43._0_12_ = auVar145;
  auVar43._13_2_ = auVar38._13_2_;
  auVar48[0xb] = 0;
  auVar48._0_11_ = auVar145._0_11_;
  auVar48._12_3_ = auVar43._12_3_;
  auVar53[10] = cVar191;
  auVar53._0_10_ = auVar145._0_10_;
  auVar53._11_4_ = auVar48._11_4_;
  auVar58[9] = 0;
  auVar58._0_9_ = auVar145._0_9_;
  auVar58._10_5_ = auVar53._10_5_;
  auVar63[8] = cVar251;
  auVar63._0_8_ = auVar145._0_8_;
  auVar63._9_6_ = auVar58._9_6_;
  Var79 = CONCAT81(CONCAT71(auVar63._8_7_,(char)((uint)uVar16 >> 0x18)),(short)cVar240 >> 7);
  auVar68._6_9_ = Var79;
  auVar68[5] = (char)((uint)uVar16 >> 0x10);
  auVar68[4] = (undefined1)((short)cVar240 >> 7);
  auVar68._0_4_ = iVar188;
  cVar251 = (char)((uint)uVar16 >> 8);
  auVar82._2_11_ = auVar68._4_11_;
  auVar82[1] = cVar251;
  auVar82[0] = (undefined1)((short)cVar240 >> 7);
  cVar212 = (char)uVar16;
  auVar73._2_13_ = auVar82;
  auVar73._0_2_ = CONCAT11(cVar212,cVar240);
  uVar186 = (undefined2)Var79;
  auVar152._0_12_ = auVar73._0_12_;
  auVar152._12_2_ = uVar186;
  auVar152._14_2_ = uVar186;
  auVar151._12_4_ = auVar152._12_4_;
  auVar151._0_10_ = auVar73._0_10_;
  auVar151._10_2_ = auVar68._4_2_;
  auVar150._10_6_ = auVar151._10_6_;
  auVar150._0_8_ = auVar73._0_8_;
  auVar150._8_2_ = auVar68._4_2_;
  auVar83._4_8_ = auVar150._8_8_;
  auVar83._2_2_ = auVar82._0_2_;
  auVar83._0_2_ = auVar82._0_2_;
  iVar189 = (int)CONCAT11(cVar212,cVar240) >> 8;
  iVar190 = auVar83._0_4_ >> 0x18;
  auVar146._0_8_ = CONCAT44(iVar190,iVar189);
  auVar146._8_4_ = auVar150._8_4_ >> 0x18;
  auVar153._12_4_ = auVar151._12_4_ >> 0x18;
  auVar153._0_12_ = auVar146;
  fVar356 = (float)iVar190;
  cVar191 = cVar251 >> 7;
  auVar39[0xd] = 0;
  auVar39._0_13_ = auVar153._0_13_;
  auVar39[0xe] = cVar191;
  auVar44[0xc] = cVar191;
  auVar44._0_12_ = auVar146;
  auVar44._13_2_ = auVar39._13_2_;
  auVar49[0xb] = 0;
  auVar49._0_11_ = auVar146._0_11_;
  auVar49._12_3_ = auVar44._12_3_;
  auVar54[10] = cVar191;
  auVar54._0_10_ = auVar146._0_10_;
  auVar54._11_4_ = auVar49._11_4_;
  auVar59[9] = 0;
  auVar59._0_9_ = auVar146._0_9_;
  auVar59._10_5_ = auVar54._10_5_;
  auVar64[8] = cVar251;
  auVar64._0_8_ = auVar146._0_8_;
  auVar64._9_6_ = auVar59._9_6_;
  Var79 = CONCAT81(CONCAT71(auVar64._8_7_,(char)((uint)uVar17 >> 0x18)),(short)cVar212 >> 7);
  auVar69._6_9_ = Var79;
  auVar69[5] = (char)((uint)uVar17 >> 0x10);
  auVar69[4] = (undefined1)((short)cVar212 >> 7);
  auVar69._0_4_ = iVar189;
  auVar84._2_11_ = auVar69._4_11_;
  auVar84[1] = (char)((uint)uVar17 >> 8);
  auVar84[0] = (undefined1)((short)cVar212 >> 7);
  sVar142 = CONCAT11((char)uVar17,cVar212);
  auVar74._2_13_ = auVar84;
  auVar74._0_2_ = sVar142;
  uVar186 = (undefined2)Var79;
  auVar156._0_12_ = auVar74._0_12_;
  auVar156._12_2_ = uVar186;
  auVar156._14_2_ = uVar186;
  auVar155._12_4_ = auVar156._12_4_;
  auVar155._0_10_ = auVar74._0_10_;
  auVar155._10_2_ = auVar69._4_2_;
  auVar154._10_6_ = auVar155._10_6_;
  auVar154._0_8_ = auVar74._0_8_;
  auVar154._8_2_ = auVar69._4_2_;
  auVar85._4_8_ = auVar154._8_8_;
  auVar85._2_2_ = auVar84._0_2_;
  auVar85._0_2_ = auVar84._0_2_;
  fVar369 = (float)((int)sVar142 >> 8);
  fVar380 = (float)(auVar85._0_4_ >> 0x18);
  fVar383 = (float)(auVar154._8_4_ >> 0x18);
  fVar257 = fVar436 * fVar369;
  fVar304 = fVar436 * fVar380;
  auVar260._0_8_ = CONCAT44(fVar304,fVar257);
  auVar260._8_4_ = fVar436 * fVar383;
  auVar266._12_4_ = fVar436 * (float)(auVar155._12_4_ >> 0x18);
  auVar266._0_12_ = auVar260;
  fVar439 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar133 + 0x16)) *
            *(float *)(prim + lVar133 + 0x1a);
  local_408[0] = (char)uVar5;
  local_408[1] = (char)((uint)uVar5 >> 8);
  local_408[2] = (undefined1)((uint)uVar5 >> 0x10);
  local_408[3] = (undefined1)((uint)uVar5 >> 0x18);
  auVar99[0xd] = 0;
  auVar99._0_13_ = auVar266._0_13_;
  auVar99[0xe] = (char)((uint)fVar304 >> 0x18);
  auVar104[0xc] = (char)((uint)fVar304 >> 0x10);
  auVar104._0_12_ = auVar260;
  auVar104._13_2_ = auVar99._13_2_;
  auVar107[0xb] = 0;
  auVar107._0_11_ = auVar260._0_11_;
  auVar107._12_3_ = auVar104._12_3_;
  auVar110[10] = (char)((uint)fVar304 >> 8);
  auVar110._0_10_ = auVar260._0_10_;
  auVar110._11_4_ = auVar107._11_4_;
  auVar113[9] = 0;
  auVar113._0_9_ = auVar260._0_9_;
  auVar113._10_5_ = auVar110._10_5_;
  auVar116[8] = SUB41(fVar304,0);
  auVar116._0_8_ = auVar260._0_8_;
  auVar116._9_6_ = auVar113._9_6_;
  Var79 = CONCAT81(CONCAT71(auVar116._8_7_,local_408[3]),(char)((uint)fVar257 >> 0x18));
  auVar119._6_9_ = Var79;
  auVar119[5] = local_408[2];
  auVar119[4] = (char)((uint)fVar257 >> 0x10);
  auVar119._0_4_ = fVar257;
  auVar122._2_11_ = auVar119._4_11_;
  auVar122[1] = local_408[1];
  auVar122[0] = (char)((uint)fVar257 >> 8);
  sVar142 = CONCAT11(local_408[0],SUB41(fVar257,0));
  auVar125._2_13_ = auVar122;
  auVar125._0_2_ = sVar142;
  uVar186 = (undefined2)Var79;
  auVar269._0_12_ = auVar125._0_12_;
  auVar269._12_2_ = uVar186;
  auVar269._14_2_ = uVar186;
  auVar268._12_4_ = auVar269._12_4_;
  auVar268._0_10_ = auVar125._0_10_;
  auVar268._10_2_ = auVar119._4_2_;
  auVar267._10_6_ = auVar268._10_6_;
  auVar267._0_8_ = auVar125._0_8_;
  auVar267._8_2_ = auVar119._4_2_;
  auVar86._4_8_ = auVar267._8_8_;
  auVar86._2_2_ = auVar122._0_2_;
  auVar86._0_2_ = auVar122._0_2_;
  iVar190 = (int)sVar142 >> 8;
  iVar305 = auVar86._0_4_ >> 0x18;
  auVar261._0_8_ = CONCAT44(iVar305,iVar190);
  auVar261._8_4_ = auVar267._8_4_ >> 0x18;
  auVar270._12_4_ = auVar268._12_4_ >> 0x18;
  auVar270._0_12_ = auVar261;
  fVar347 = (float)iVar305;
  local_418._0_1_ = (undefined1)uVar6;
  local_418._1_1_ = (undefined1)((uint)uVar6 >> 8);
  local_418._2_1_ = (undefined1)((uint)uVar6 >> 0x10);
  local_418._3_1_ = (undefined1)((uint)uVar6 >> 0x18);
  cVar191 = local_408[1] >> 7;
  auVar100[0xd] = 0;
  auVar100._0_13_ = auVar270._0_13_;
  auVar100[0xe] = cVar191;
  auVar105[0xc] = cVar191;
  auVar105._0_12_ = auVar261;
  auVar105._13_2_ = auVar100._13_2_;
  auVar108[0xb] = 0;
  auVar108._0_11_ = auVar261._0_11_;
  auVar108._12_3_ = auVar105._12_3_;
  auVar111[10] = cVar191;
  auVar111._0_10_ = auVar261._0_10_;
  auVar111._11_4_ = auVar108._11_4_;
  auVar114[9] = 0;
  auVar114._0_9_ = auVar261._0_9_;
  auVar114._10_5_ = auVar111._10_5_;
  auVar117[8] = local_408[1];
  auVar117._0_8_ = auVar261._0_8_;
  auVar117._9_6_ = auVar114._9_6_;
  Var79 = CONCAT81(CONCAT71(auVar117._8_7_,local_418._3_1_),(short)local_408[0] >> 7);
  auVar120._6_9_ = Var79;
  auVar120[5] = local_418._2_1_;
  auVar120[4] = (undefined1)((short)local_408[0] >> 7);
  auVar120._0_4_ = iVar190;
  auVar123._2_11_ = auVar120._4_11_;
  auVar123[1] = local_418._1_1_;
  auVar123[0] = (undefined1)((short)local_408[0] >> 7);
  auVar126._2_13_ = auVar123;
  auVar126._0_2_ = CONCAT11((undefined1)local_418,local_408[0]);
  uVar186 = (undefined2)Var79;
  auVar273._0_12_ = auVar126._0_12_;
  auVar273._12_2_ = uVar186;
  auVar273._14_2_ = uVar186;
  auVar272._12_4_ = auVar273._12_4_;
  auVar272._0_10_ = auVar126._0_10_;
  auVar272._10_2_ = auVar120._4_2_;
  auVar271._10_6_ = auVar272._10_6_;
  auVar271._0_8_ = auVar126._0_8_;
  auVar271._8_2_ = auVar120._4_2_;
  auVar87._4_8_ = auVar271._8_8_;
  auVar87._2_2_ = auVar123._0_2_;
  auVar87._0_2_ = auVar123._0_2_;
  fVar258 = (float)((int)CONCAT11((undefined1)local_418,local_408[0]) >> 8);
  fVar306 = (float)(auVar87._0_4_ >> 0x18);
  auVar262._0_8_ = CONCAT44(fVar306,fVar258);
  auVar262._8_4_ = (float)(auVar271._8_4_ >> 0x18);
  auVar274._12_4_ = (float)(auVar272._12_4_ >> 0x18);
  auVar274._0_12_ = auVar262;
  auVar101[0xd] = 0;
  auVar101._0_13_ = auVar274._0_13_;
  auVar101[0xe] = (char)((uint)fVar306 >> 0x18);
  auVar106[0xc] = (char)((uint)fVar306 >> 0x10);
  auVar106._0_12_ = auVar262;
  auVar106._13_2_ = auVar101._13_2_;
  auVar109[0xb] = 0;
  auVar109._0_11_ = auVar262._0_11_;
  auVar109._12_3_ = auVar106._12_3_;
  auVar112[10] = (char)((uint)fVar306 >> 8);
  auVar112._0_10_ = auVar262._0_10_;
  auVar112._11_4_ = auVar109._11_4_;
  auVar115[9] = 0;
  auVar115._0_9_ = auVar262._0_9_;
  auVar115._10_5_ = auVar112._10_5_;
  auVar118[8] = SUB41(fVar306,0);
  auVar118._0_8_ = auVar262._0_8_;
  auVar118._9_6_ = auVar115._9_6_;
  Var79 = CONCAT81(CONCAT71(auVar118._8_7_,uVar187),(char)((uint)fVar258 >> 0x18));
  auVar121._6_9_ = Var79;
  auVar121[5] = uVar185;
  auVar121[4] = (char)((uint)fVar258 >> 0x10);
  auVar121._0_4_ = fVar258;
  auVar124._2_11_ = auVar121._4_11_;
  auVar124[1] = cVar184;
  auVar124[0] = (char)((uint)fVar258 >> 8);
  sVar142 = CONCAT11(cVar141,SUB41(fVar258,0));
  auVar127._2_13_ = auVar124;
  auVar127._0_2_ = sVar142;
  uVar186 = (undefined2)Var79;
  auVar277._0_12_ = auVar127._0_12_;
  auVar277._12_2_ = uVar186;
  auVar277._14_2_ = uVar186;
  auVar276._12_4_ = auVar277._12_4_;
  auVar276._0_10_ = auVar127._0_10_;
  auVar276._10_2_ = auVar121._4_2_;
  auVar275._10_6_ = auVar276._10_6_;
  auVar275._0_8_ = auVar127._0_8_;
  auVar275._8_2_ = auVar121._4_2_;
  auVar88._4_8_ = auVar275._8_8_;
  auVar88._2_2_ = auVar124._0_2_;
  auVar88._0_2_ = auVar124._0_2_;
  iVar305 = (int)sVar142 >> 8;
  iVar307 = auVar88._0_4_ >> 0x18;
  auVar263._0_8_ = CONCAT44(iVar307,iVar305);
  auVar263._8_4_ = auVar275._8_4_ >> 0x18;
  auVar278._12_4_ = auVar276._12_4_ >> 0x18;
  auVar278._0_12_ = auVar263;
  fVar413 = (float)iVar307;
  cVar191 = cVar184 >> 7;
  auVar40[0xd] = 0;
  auVar40._0_13_ = auVar278._0_13_;
  auVar40[0xe] = cVar191;
  auVar45[0xc] = cVar191;
  auVar45._0_12_ = auVar263;
  auVar45._13_2_ = auVar40._13_2_;
  auVar50[0xb] = 0;
  auVar50._0_11_ = auVar263._0_11_;
  auVar50._12_3_ = auVar45._12_3_;
  auVar55[10] = cVar191;
  auVar55._0_10_ = auVar263._0_10_;
  auVar55._11_4_ = auVar50._11_4_;
  auVar60[9] = 0;
  auVar60._0_9_ = auVar263._0_9_;
  auVar60._10_5_ = auVar55._10_5_;
  auVar65[8] = cVar184;
  auVar65._0_8_ = auVar263._0_8_;
  auVar65._9_6_ = auVar60._9_6_;
  Var79 = CONCAT81(CONCAT71(auVar65._8_7_,(char)((uint)uVar19 >> 0x18)),(short)cVar141 >> 7);
  auVar70._6_9_ = Var79;
  auVar70[5] = (char)((uint)uVar19 >> 0x10);
  auVar70[4] = (undefined1)((short)cVar141 >> 7);
  auVar70._0_4_ = iVar305;
  cVar191 = (char)((uint)uVar19 >> 8);
  auVar89._2_11_ = auVar70._4_11_;
  auVar89[1] = cVar191;
  auVar89[0] = (undefined1)((short)cVar141 >> 7);
  cVar184 = (char)uVar19;
  auVar75._2_13_ = auVar89;
  auVar75._0_2_ = CONCAT11(cVar184,cVar141);
  uVar186 = (undefined2)Var79;
  auVar281._0_12_ = auVar75._0_12_;
  auVar281._12_2_ = uVar186;
  auVar281._14_2_ = uVar186;
  auVar280._12_4_ = auVar281._12_4_;
  auVar280._0_10_ = auVar75._0_10_;
  auVar280._10_2_ = auVar70._4_2_;
  auVar279._10_6_ = auVar280._10_6_;
  auVar279._0_8_ = auVar75._0_8_;
  auVar279._8_2_ = auVar70._4_2_;
  auVar90._4_8_ = auVar279._8_8_;
  auVar90._2_2_ = auVar89._0_2_;
  auVar90._0_2_ = auVar89._0_2_;
  iVar307 = (int)CONCAT11(cVar184,cVar141) >> 8;
  iVar308 = auVar90._0_4_ >> 0x18;
  auVar264._0_8_ = CONCAT44(iVar308,iVar307);
  auVar264._8_4_ = auVar279._8_4_ >> 0x18;
  auVar282._12_4_ = auVar280._12_4_ >> 0x18;
  auVar282._0_12_ = auVar264;
  fVar446 = (float)iVar308;
  cVar141 = cVar191 >> 7;
  auVar41[0xd] = 0;
  auVar41._0_13_ = auVar282._0_13_;
  auVar41[0xe] = cVar141;
  auVar46[0xc] = cVar141;
  auVar46._0_12_ = auVar264;
  auVar46._13_2_ = auVar41._13_2_;
  auVar51[0xb] = 0;
  auVar51._0_11_ = auVar264._0_11_;
  auVar51._12_3_ = auVar46._12_3_;
  auVar56[10] = cVar141;
  auVar56._0_10_ = auVar264._0_10_;
  auVar56._11_4_ = auVar51._11_4_;
  auVar61[9] = 0;
  auVar61._0_9_ = auVar264._0_9_;
  auVar61._10_5_ = auVar56._10_5_;
  auVar66[8] = cVar191;
  auVar66._0_8_ = auVar264._0_8_;
  auVar66._9_6_ = auVar61._9_6_;
  Var79 = CONCAT81(CONCAT71(auVar66._8_7_,(char)((uint)uVar20 >> 0x18)),(short)cVar184 >> 7);
  auVar71._6_9_ = Var79;
  auVar71[5] = (char)((uint)uVar20 >> 0x10);
  auVar71[4] = (undefined1)((short)cVar184 >> 7);
  auVar71._0_4_ = iVar307;
  auVar91._2_11_ = auVar71._4_11_;
  auVar91[1] = (char)((uint)uVar20 >> 8);
  auVar91[0] = (undefined1)((short)cVar184 >> 7);
  sVar142 = CONCAT11((char)uVar20,cVar184);
  auVar76._2_13_ = auVar91;
  auVar76._0_2_ = sVar142;
  uVar186 = (undefined2)Var79;
  auVar285._0_12_ = auVar76._0_12_;
  auVar285._12_2_ = uVar186;
  auVar285._14_2_ = uVar186;
  auVar284._12_4_ = auVar285._12_4_;
  auVar284._0_10_ = auVar76._0_10_;
  auVar284._10_2_ = auVar71._4_2_;
  auVar283._10_6_ = auVar284._10_6_;
  auVar283._0_8_ = auVar76._0_8_;
  auVar283._8_2_ = auVar71._4_2_;
  auVar92._4_8_ = auVar283._8_8_;
  auVar92._2_2_ = auVar91._0_2_;
  auVar92._0_2_ = auVar91._0_2_;
  fVar417 = (float)((int)sVar142 >> 8);
  fVar423 = (float)(auVar92._0_4_ >> 0x18);
  fVar425 = (float)(auVar283._8_4_ >> 0x18);
  fVar259 = fVar428 * (float)iVar190 + fVar434 * (float)iVar143 + fVar436 * (float)iVar188;
  fVar309 = fVar428 * fVar347 + fVar434 * fVar368 + fVar436 * fVar396;
  fVar310 = fVar428 * (float)auVar261._8_4_ +
            fVar434 * (float)auVar144._8_4_ + fVar436 * (float)auVar145._8_4_;
  fVar313 = fVar428 * (float)auVar270._12_4_ +
            fVar434 * (float)auVar232._12_4_ + fVar436 * (float)auVar149._12_4_;
  fVar443 = fVar428 * fVar258 + fVar434 * (float)iVar189 + fVar257;
  fVar447 = fVar428 * fVar306 + fVar434 * fVar356 + fVar304;
  fVar448 = fVar428 * auVar262._8_4_ + fVar434 * (float)auVar146._8_4_ + auVar260._8_4_;
  fVar449 = fVar428 * auVar274._12_4_ + fVar434 * (float)auVar153._12_4_ + auVar266._12_4_;
  fVar257 = fVar428 * (float)iVar305 + fVar434 * (float)iVar307 + fVar436 * fVar417;
  fVar304 = fVar428 * fVar413 + fVar434 * fVar446 + fVar436 * fVar423;
  fVar192 = fVar428 * (float)auVar263._8_4_ + fVar434 * (float)auVar264._8_4_ + fVar436 * fVar425;
  fVar436 = fVar428 * (float)auVar278._12_4_ +
            fVar434 * (float)auVar282._12_4_ + fVar436 * (float)(auVar284._12_4_ >> 0x18);
  uVar407 = *(undefined8 *)(prim + uVar129 * 7 + 6);
  uVar130 = *(ulong *)(prim + uVar129 * 0xb + 6);
  _fStack_350 = 0;
  _local_358 = uVar130;
  auVar293 = _local_358;
  uVar7 = *(undefined8 *)(prim + uVar129 * 9 + 6);
  uVar8 = *(undefined8 *)(prim + uVar129 * 0xd + 6);
  uVar9 = *(undefined8 *)(prim + uVar129 * 0x12 + 6);
  uStack_340 = 0;
  fVar429 = (float)iVar190 * fVar316 + (float)iVar143 * fVar338 + (float)iVar188 * fVar339;
  fVar435 = fVar347 * fVar316 + fVar368 * fVar338 + fVar396 * fVar339;
  fVar437 = (float)auVar261._8_4_ * fVar316 +
            (float)auVar144._8_4_ * fVar338 + (float)auVar145._8_4_ * fVar339;
  fVar438 = (float)auVar270._12_4_ * fVar316 +
            (float)auVar232._12_4_ * fVar338 + (float)auVar149._12_4_ * fVar339;
  fVar428 = fVar258 * fVar316 + (float)iVar189 * fVar338 + fVar369 * fVar339;
  fVar434 = fVar306 * fVar316 + fVar356 * fVar338 + fVar380 * fVar339;
  fVar253 = auVar262._8_4_ * fVar316 + (float)auVar146._8_4_ * fVar338 + fVar383 * fVar339;
  fVar255 = auVar274._12_4_ * fVar316 +
            (float)auVar153._12_4_ * fVar338 + (float)(auVar155._12_4_ >> 0x18) * fVar339;
  fVar383 = fVar316 * (float)iVar305 + fVar338 * (float)iVar307 + fVar339 * fVar417;
  fVar396 = fVar316 * fVar413 + fVar338 * fVar446 + fVar339 * fVar423;
  fVar413 = fVar316 * (float)auVar263._8_4_ + fVar338 * (float)auVar264._8_4_ + fVar339 * fVar425;
  fVar417 = fVar316 * (float)auVar278._12_4_ +
            fVar338 * (float)auVar282._12_4_ + fVar339 * (float)(auVar284._12_4_ >> 0x18);
  auVar245._0_4_ = (float)DAT_01f4bd50;
  fVar258 = DAT_01f4bd50._4_4_;
  fVar306 = DAT_01f4bd50._8_4_;
  auVar248._0_12_ = DAT_01f4bd50._0_12_;
  fVar316 = DAT_01f4bd50._12_4_;
  uVar137 = -(uint)(auVar245._0_4_ <= ABS(fVar259));
  uVar138 = -(uint)(fVar258 <= ABS(fVar309));
  uVar139 = -(uint)(fVar306 <= ABS(fVar310));
  uVar140 = -(uint)(fVar316 <= ABS(fVar313));
  auVar286._0_4_ = (uint)fVar259 & uVar137;
  auVar286._4_4_ = (uint)fVar309 & uVar138;
  auVar286._8_4_ = (uint)fVar310 & uVar139;
  auVar286._12_4_ = (uint)fVar313 & uVar140;
  auVar215._0_4_ = ~uVar137 & (uint)auVar245._0_4_;
  auVar215._4_4_ = ~uVar138 & (uint)fVar258;
  auVar215._8_4_ = ~uVar139 & (uint)fVar306;
  auVar215._12_4_ = ~uVar140 & (uint)fVar316;
  auVar215 = auVar215 | auVar286;
  uVar137 = -(uint)(auVar245._0_4_ <= ABS(fVar443));
  uVar138 = -(uint)(fVar258 <= ABS(fVar447));
  uVar139 = -(uint)(fVar306 <= ABS(fVar448));
  uVar140 = -(uint)(fVar316 <= ABS(fVar449));
  auVar444._0_4_ = (uint)fVar443 & uVar137;
  auVar444._4_4_ = (uint)fVar447 & uVar138;
  auVar444._8_4_ = (uint)fVar448 & uVar139;
  auVar444._12_4_ = (uint)fVar449 & uVar140;
  auVar287._0_4_ = ~uVar137 & (uint)auVar245._0_4_;
  auVar287._4_4_ = ~uVar138 & (uint)fVar258;
  auVar287._8_4_ = ~uVar139 & (uint)fVar306;
  auVar287._12_4_ = ~uVar140 & (uint)fVar316;
  auVar287 = auVar287 | auVar444;
  uVar137 = -(uint)(auVar245._0_4_ <= ABS(fVar257));
  uVar138 = -(uint)(fVar258 <= ABS(fVar304));
  uVar139 = -(uint)(fVar306 <= ABS(fVar192));
  uVar140 = -(uint)(fVar316 <= ABS(fVar436));
  auVar157._0_4_ = (uint)fVar257 & uVar137;
  auVar157._4_4_ = (uint)fVar304 & uVar138;
  auVar157._8_4_ = (uint)fVar192 & uVar139;
  auVar157._12_4_ = (uint)fVar436 & uVar140;
  auVar319._0_4_ = ~uVar137 & (uint)auVar245._0_4_;
  auVar319._4_4_ = ~uVar138 & (uint)fVar258;
  auVar319._8_4_ = ~uVar139 & (uint)fVar306;
  auVar319._12_4_ = ~uVar140 & (uint)fVar316;
  auVar319 = auVar319 | auVar157;
  auVar158 = rcpps(auVar157,auVar215);
  fVar436 = auVar158._0_4_;
  fVar192 = auVar158._4_4_;
  fVar310 = auVar158._8_4_;
  fVar368 = auVar158._12_4_;
  fVar436 = (1.0 - auVar215._0_4_ * fVar436) * fVar436 + fVar436;
  fVar192 = (1.0 - auVar215._4_4_ * fVar192) * fVar192 + fVar192;
  fVar310 = (1.0 - auVar215._8_4_ * fVar310) * fVar310 + fVar310;
  fVar368 = (1.0 - auVar215._12_4_ * fVar368) * fVar368 + fVar368;
  auVar158 = rcpps(auVar158,auVar287);
  fVar257 = auVar158._0_4_;
  auVar288._0_4_ = auVar287._0_4_ * fVar257;
  fVar258 = auVar158._4_4_;
  fVar316 = auVar287._4_4_ * fVar258;
  auVar265._0_8_ = CONCAT44(fVar316,auVar288._0_4_);
  fVar313 = auVar158._8_4_;
  auVar265._8_4_ = auVar287._8_4_ * fVar313;
  fVar369 = auVar158._12_4_;
  fVar257 = (1.0 - auVar288._0_4_) * fVar257 + fVar257;
  fVar258 = (1.0 - fVar316) * fVar258 + fVar258;
  fVar313 = (1.0 - auVar265._8_4_) * fVar313 + fVar313;
  fVar369 = (1.0 - auVar287._12_4_ * fVar369) * fVar369 + fVar369;
  auVar158 = rcpps(auVar158,auVar319);
  fVar304 = auVar158._0_4_;
  auVar320._0_4_ = auVar319._0_4_ * fVar304;
  fVar306 = auVar158._4_4_;
  fVar259 = auVar319._4_4_ * fVar306;
  auVar317._0_8_ = CONCAT44(fVar259,auVar320._0_4_);
  fVar338 = auVar158._8_4_;
  auVar317._8_4_ = auVar319._8_4_ * fVar338;
  fVar380 = auVar158._12_4_;
  uVar132 = *(ulong *)(prim + uVar129 * 0x16 + 6);
  fVar304 = (1.0 - auVar320._0_4_) * fVar304 + fVar304;
  fVar306 = (1.0 - fVar259) * fVar306 + fVar306;
  fVar338 = (1.0 - auVar317._8_4_) * fVar338 + fVar338;
  fVar380 = (1.0 - auVar319._12_4_ * fVar380) * fVar380 + fVar380;
  uVar10 = *(ulong *)(prim + uVar129 * 0x14 + 6);
  local_3f8._0_2_ = (undefined2)uVar407;
  local_3f8._2_2_ = (undefined2)((ulong)uVar407 >> 0x10);
  local_3f8._4_2_ = (undefined2)((ulong)uVar407 >> 0x20);
  uStack_3f2 = (undefined2)((ulong)uVar407 >> 0x30);
  auVar248._12_2_ = DAT_01f4bd50._6_2_;
  auVar248._14_2_ = uStack_3f2;
  auVar247._12_4_ = auVar248._12_4_;
  auVar247._0_10_ = (unkbyte10)DAT_01f4bd50;
  auVar247._10_2_ = local_3f8._4_2_;
  auVar246._10_6_ = auVar247._10_6_;
  auVar246._0_8_ = (undefined8)DAT_01f4bd50;
  auVar246._8_2_ = DAT_01f4bd50._4_2_;
  auVar245._8_8_ = auVar246._8_8_;
  auVar245._6_2_ = local_3f8._2_2_;
  auVar245._4_2_ = DAT_01f4bd50._2_2_;
  fVar423 = (float)(auVar245._4_4_ >> 0x10);
  fVar425 = (float)(auVar246._8_4_ >> 0x10);
  local_358._0_2_ = (undefined2)uVar130;
  local_358._2_2_ = (undefined2)(uVar130 >> 0x10);
  local_358._4_2_ = (undefined2)(uVar130 >> 0x20);
  uStack_352 = (undefined2)(uVar130 >> 0x30);
  auVar291._12_2_ = (short)((uint)fVar316 >> 0x10);
  auVar291._0_12_ = auVar265;
  auVar291._14_2_ = uStack_352;
  auVar290._12_4_ = auVar291._12_4_;
  auVar290._0_10_ = auVar265._0_10_;
  auVar290._10_2_ = local_358._4_2_;
  auVar289._10_6_ = auVar290._10_6_;
  auVar289._8_2_ = SUB42(fVar316,0);
  auVar289._0_8_ = auVar265._0_8_;
  auVar288._8_8_ = auVar289._8_8_;
  auVar288._6_2_ = local_358._2_2_;
  auVar288._4_2_ = (short)((uint)auVar288._0_4_ >> 0x10);
  uVar407 = *(undefined8 *)(prim + uVar129 * 0x18 + 6);
  auVar323._12_2_ = (short)((uint)fVar259 >> 0x10);
  auVar323._0_12_ = auVar317;
  auVar323._14_2_ = (short)((ulong)uVar7 >> 0x30);
  auVar322._12_4_ = auVar323._12_4_;
  auVar322._0_10_ = auVar317._0_10_;
  auVar322._10_2_ = (short)((ulong)uVar7 >> 0x20);
  auVar321._10_6_ = auVar322._10_6_;
  auVar321._8_2_ = SUB42(fVar259,0);
  auVar321._0_8_ = auVar317._0_8_;
  auVar320._8_8_ = auVar321._8_8_;
  sVar142 = (short)((ulong)uVar7 >> 0x10);
  auVar320._6_2_ = sVar142;
  auVar320._4_2_ = (short)((uint)auVar320._0_4_ >> 0x10);
  auVar324._0_4_ = (int)(short)uVar7;
  iVar143 = auVar320._4_4_ >> 0x10;
  auVar318._0_8_ = CONCAT44(iVar143,auVar324._0_4_);
  auVar318._8_4_ = auVar321._8_4_ >> 0x10;
  auVar341._0_4_ = (float)auVar324._0_4_;
  fVar443 = (float)iVar143;
  auVar340._0_8_ = CONCAT44(fVar443,auVar341._0_4_);
  auVar340._8_4_ = (float)auVar318._8_4_;
  auVar327._12_2_ = sVar142 >> 0xf;
  auVar327._0_12_ = auVar318;
  auVar327._14_2_ = (short)((ulong)uVar8 >> 0x30);
  auVar326._12_4_ = auVar327._12_4_;
  auVar326._0_10_ = auVar318._0_10_;
  auVar326._10_2_ = (short)((ulong)uVar8 >> 0x20);
  auVar325._10_6_ = auVar326._10_6_;
  auVar325._8_2_ = sVar142;
  auVar325._0_8_ = auVar318._0_8_;
  auVar324._8_8_ = auVar325._8_8_;
  auVar324._6_2_ = (short)((ulong)uVar8 >> 0x10);
  auVar324._4_2_ = (short)uVar7 >> 0xf;
  local_348._0_2_ = (short)uVar9;
  local_348._2_2_ = (undefined2)((ulong)uVar9 >> 0x10);
  local_348._4_2_ = (undefined2)((ulong)uVar9 >> 0x20);
  local_348._6_2_ = (undefined2)((ulong)uVar9 >> 0x30);
  auVar344._12_2_ = (short)((uint)fVar443 >> 0x10);
  auVar344._0_12_ = auVar340;
  auVar344._14_2_ = local_348._6_2_;
  auVar343._12_4_ = auVar344._12_4_;
  auVar343._0_10_ = auVar340._0_10_;
  auVar343._10_2_ = local_348._4_2_;
  auVar342._10_6_ = auVar343._10_6_;
  auVar342._8_2_ = SUB42(fVar443,0);
  auVar342._0_8_ = auVar340._0_8_;
  auVar341._8_8_ = auVar342._8_8_;
  auVar341._6_2_ = local_348._2_2_;
  auVar341._4_2_ = (short)((uint)auVar341._0_4_ >> 0x10);
  fVar446 = (float)(auVar341._4_4_ >> 0x10);
  fVar447 = (float)(auVar342._8_4_ >> 0x10);
  uVar186 = (undefined2)(uVar132 >> 0x30);
  auVar218._8_4_ = 0;
  auVar218._0_8_ = uVar132;
  auVar218._12_2_ = uVar186;
  auVar218._14_2_ = uVar186;
  uVar186 = (undefined2)(uVar132 >> 0x20);
  auVar217._12_4_ = auVar218._12_4_;
  auVar217._8_2_ = 0;
  auVar217._0_8_ = uVar132;
  auVar217._10_2_ = uVar186;
  auVar216._10_6_ = auVar217._10_6_;
  auVar216._8_2_ = uVar186;
  auVar216._0_8_ = uVar132;
  sVar142 = (short)(uVar132 >> 0x10);
  auVar93._4_8_ = auVar216._8_8_;
  auVar93._2_2_ = sVar142;
  auVar93._0_2_ = sVar142;
  auVar219._0_4_ = (int)(short)uVar132;
  iVar143 = auVar93._0_4_ >> 0x10;
  auVar214._0_8_ = CONCAT44(iVar143,auVar219._0_4_);
  auVar214._8_4_ = auVar216._8_4_ >> 0x10;
  uVar186 = (undefined2)(uVar10 >> 0x30);
  auVar161._8_4_ = 0;
  auVar161._0_8_ = uVar10;
  auVar161._12_2_ = uVar186;
  auVar161._14_2_ = uVar186;
  uVar186 = (undefined2)(uVar10 >> 0x20);
  auVar160._12_4_ = auVar161._12_4_;
  auVar160._8_2_ = 0;
  auVar160._0_8_ = uVar10;
  auVar160._10_2_ = uVar186;
  auVar159._10_6_ = auVar160._10_6_;
  auVar159._8_2_ = uVar186;
  auVar159._0_8_ = uVar10;
  uVar186 = (undefined2)(uVar10 >> 0x10);
  auVar94._4_8_ = auVar159._8_8_;
  auVar94._2_2_ = uVar186;
  auVar94._0_2_ = uVar186;
  fVar316 = (float)(auVar94._0_4_ >> 0x10);
  fVar339 = (float)(auVar159._8_4_ >> 0x10);
  auVar222._12_2_ = sVar142 >> 0xf;
  auVar222._0_12_ = auVar214;
  auVar222._14_2_ = (short)((ulong)uVar407 >> 0x30);
  auVar221._12_4_ = auVar222._12_4_;
  auVar221._0_10_ = auVar214._0_10_;
  auVar221._10_2_ = (short)((ulong)uVar407 >> 0x20);
  auVar220._10_6_ = auVar221._10_6_;
  auVar220._8_2_ = sVar142;
  auVar220._0_8_ = auVar214._0_8_;
  auVar219._8_8_ = auVar220._8_8_;
  auVar219._6_2_ = (short)((ulong)uVar407 >> 0x10);
  auVar219._4_2_ = (short)uVar132 >> 0xf;
  uVar130 = *(ulong *)(prim + uVar129 * 0x1d + 6);
  uVar186 = (undefined2)(uVar130 >> 0x30);
  auVar164._8_4_ = 0;
  auVar164._0_8_ = uVar130;
  auVar164._12_2_ = uVar186;
  auVar164._14_2_ = uVar186;
  uVar186 = (undefined2)(uVar130 >> 0x20);
  auVar163._12_4_ = auVar164._12_4_;
  auVar163._8_2_ = 0;
  auVar163._0_8_ = uVar130;
  auVar163._10_2_ = uVar186;
  auVar162._10_6_ = auVar163._10_6_;
  auVar162._8_2_ = uVar186;
  auVar162._0_8_ = uVar130;
  uVar186 = (undefined2)(uVar130 >> 0x10);
  auVar95._4_8_ = auVar162._8_8_;
  auVar95._2_2_ = uVar186;
  auVar95._0_2_ = uVar186;
  fVar259 = (float)(auVar95._0_4_ >> 0x10);
  fVar347 = (float)(auVar162._8_4_ >> 0x10);
  uVar132 = *(ulong *)(prim + uVar129 * 0x21 + 6);
  uVar186 = (undefined2)(uVar132 >> 0x30);
  auVar225._8_4_ = 0;
  auVar225._0_8_ = uVar132;
  auVar225._12_2_ = uVar186;
  auVar225._14_2_ = uVar186;
  uVar186 = (undefined2)(uVar132 >> 0x20);
  auVar224._12_4_ = auVar225._12_4_;
  auVar224._8_2_ = 0;
  auVar224._0_8_ = uVar132;
  auVar224._10_2_ = uVar186;
  auVar223._10_6_ = auVar224._10_6_;
  auVar223._8_2_ = uVar186;
  auVar223._0_8_ = uVar132;
  uVar186 = (undefined2)(uVar132 >> 0x10);
  auVar96._4_8_ = auVar223._8_8_;
  auVar96._2_2_ = uVar186;
  auVar96._0_2_ = uVar186;
  uVar11 = *(ulong *)(prim + uVar129 * 0x1f + 6);
  uVar186 = (undefined2)(uVar11 >> 0x30);
  auVar167._8_4_ = 0;
  auVar167._0_8_ = uVar11;
  auVar167._12_2_ = uVar186;
  auVar167._14_2_ = uVar186;
  uVar186 = (undefined2)(uVar11 >> 0x20);
  auVar166._12_4_ = auVar167._12_4_;
  auVar166._8_2_ = 0;
  auVar166._0_8_ = uVar11;
  auVar166._10_2_ = uVar186;
  auVar165._10_6_ = auVar166._10_6_;
  auVar165._8_2_ = uVar186;
  auVar165._0_8_ = uVar11;
  uVar186 = (undefined2)(uVar11 >> 0x10);
  auVar97._4_8_ = auVar165._8_8_;
  auVar97._2_2_ = uVar186;
  auVar97._0_2_ = uVar186;
  fVar309 = (float)(auVar97._0_4_ >> 0x10);
  fVar356 = (float)(auVar165._8_4_ >> 0x10);
  uVar12 = *(ulong *)(prim + uVar129 * 0x23 + 6);
  uVar186 = (undefined2)(uVar12 >> 0x30);
  auVar228._8_4_ = 0;
  auVar228._0_8_ = uVar12;
  auVar228._12_2_ = uVar186;
  auVar228._14_2_ = uVar186;
  uVar186 = (undefined2)(uVar12 >> 0x20);
  auVar227._12_4_ = auVar228._12_4_;
  auVar227._8_2_ = 0;
  auVar227._0_8_ = uVar12;
  auVar227._10_2_ = uVar186;
  auVar226._10_6_ = auVar227._10_6_;
  auVar226._8_2_ = uVar186;
  auVar226._0_8_ = uVar12;
  uVar186 = (undefined2)(uVar12 >> 0x10);
  auVar98._4_8_ = auVar226._8_8_;
  auVar98._2_2_ = uVar186;
  auVar98._0_2_ = uVar186;
  auVar292._0_8_ =
       CONCAT44(((((float)(auVar288._4_4_ >> 0x10) - fVar423) * fVar439 + fVar423) - fVar435) *
                fVar192,((((float)(int)(short)local_358._0_2_ - (float)(int)(short)local_3f8._0_2_)
                          * fVar439 + (float)(int)(short)local_3f8._0_2_) - fVar429) * fVar436);
  auVar292._8_4_ =
       ((((float)(auVar289._8_4_ >> 0x10) - fVar425) * fVar439 + fVar425) - fVar437) * fVar310;
  auVar292._12_4_ =
       ((((float)(auVar290._12_4_ >> 0x10) - (float)(auVar247._12_4_ >> 0x10)) * fVar439 +
        (float)(auVar247._12_4_ >> 0x10)) - fVar438) * fVar368;
  auVar328._0_4_ =
       ((((float)(int)(short)uVar8 - auVar341._0_4_) * fVar439 + auVar341._0_4_) - fVar429) *
       fVar436;
  auVar328._4_4_ =
       ((((float)(auVar324._4_4_ >> 0x10) - fVar443) * fVar439 + fVar443) - fVar435) * fVar192;
  auVar328._8_4_ =
       ((((float)(auVar325._8_4_ >> 0x10) - auVar340._8_4_) * fVar439 + auVar340._8_4_) - fVar437) *
       fVar310;
  auVar328._12_4_ =
       ((((float)(auVar326._12_4_ >> 0x10) - (float)(auVar322._12_4_ >> 0x10)) * fVar439 +
        (float)(auVar322._12_4_ >> 0x10)) - fVar438) * fVar368;
  auVar345._0_8_ =
       CONCAT44(((((float)iVar143 - fVar446) * fVar439 + fVar446) - fVar434) * fVar258,
                ((((float)auVar219._0_4_ - (float)(int)(short)local_348) * fVar439 +
                 (float)(int)(short)local_348) - fVar428) * fVar257);
  auVar345._8_4_ = ((((float)auVar214._8_4_ - fVar447) * fVar439 + fVar447) - fVar253) * fVar313;
  auVar345._12_4_ =
       ((((float)(auVar217._12_4_ >> 0x10) - (float)(auVar343._12_4_ >> 0x10)) * fVar439 +
        (float)(auVar343._12_4_ >> 0x10)) - fVar255) * fVar369;
  auVar372._0_4_ =
       ((((float)(int)(short)uVar407 - (float)(int)(short)uVar10) * fVar439 +
        (float)(int)(short)uVar10) - fVar428) * fVar257;
  auVar372._4_4_ =
       ((((float)(auVar219._4_4_ >> 0x10) - fVar316) * fVar439 + fVar316) - fVar434) * fVar258;
  auVar372._8_4_ =
       ((((float)(auVar220._8_4_ >> 0x10) - fVar339) * fVar439 + fVar339) - fVar253) * fVar313;
  auVar372._12_4_ =
       ((((float)(auVar221._12_4_ >> 0x10) - (float)(auVar160._12_4_ >> 0x10)) * fVar439 +
        (float)(auVar160._12_4_ >> 0x10)) - fVar255) * fVar369;
  auVar408._0_8_ =
       CONCAT44(((((float)(auVar96._0_4_ >> 0x10) - fVar259) * fVar439 + fVar259) - fVar396) *
                fVar306,((((float)(int)(short)uVar132 - (float)(int)(short)uVar130) * fVar439 +
                         (float)(int)(short)uVar130) - fVar383) * fVar304);
  auVar408._8_4_ =
       ((((float)(auVar223._8_4_ >> 0x10) - fVar347) * fVar439 + fVar347) - fVar413) * fVar338;
  auVar408._12_4_ =
       ((((float)(auVar224._12_4_ >> 0x10) - (float)(auVar163._12_4_ >> 0x10)) * fVar439 +
        (float)(auVar163._12_4_ >> 0x10)) - fVar417) * fVar380;
  auVar419._0_4_ =
       ((((float)(int)(short)uVar12 - (float)(int)(short)uVar11) * fVar439 +
        (float)(int)(short)uVar11) - fVar383) * fVar304;
  auVar419._4_4_ =
       ((((float)(auVar98._0_4_ >> 0x10) - fVar309) * fVar439 + fVar309) - fVar396) * fVar306;
  auVar419._8_4_ =
       ((((float)(auVar226._8_4_ >> 0x10) - fVar356) * fVar439 + fVar356) - fVar413) * fVar338;
  auVar419._12_4_ =
       ((((float)(auVar227._12_4_ >> 0x10) - (float)(auVar166._12_4_ >> 0x10)) * fVar439 +
        (float)(auVar166._12_4_ >> 0x10)) - fVar417) * fVar380;
  auVar229._8_4_ = auVar292._8_4_;
  auVar229._0_8_ = auVar292._0_8_;
  auVar229._12_4_ = auVar292._12_4_;
  auVar230 = minps(auVar229,auVar328);
  auVar168._8_4_ = auVar345._8_4_;
  auVar168._0_8_ = auVar345._0_8_;
  auVar168._12_4_ = auVar345._12_4_;
  auVar158 = minps(auVar168,auVar372);
  auVar230 = maxps(auVar230,auVar158);
  auVar169._8_4_ = auVar408._8_4_;
  auVar169._0_8_ = auVar408._0_8_;
  auVar169._12_4_ = auVar408._12_4_;
  auVar158 = minps(auVar169,auVar419);
  uVar5 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar193._4_4_ = uVar5;
  auVar193._0_4_ = uVar5;
  auVar193._8_4_ = uVar5;
  auVar193._12_4_ = uVar5;
  auVar158 = maxps(auVar158,auVar193);
  auVar158 = maxps(auVar230,auVar158);
  local_188 = auVar158._0_4_ * 0.99999964;
  fStack_184 = auVar158._4_4_ * 0.99999964;
  fStack_180 = auVar158._8_4_ * 0.99999964;
  fStack_17c = auVar158._12_4_ * 0.99999964;
  auVar158 = maxps(auVar292,auVar328);
  auVar230 = maxps(auVar345,auVar372);
  auVar158 = minps(auVar158,auVar230);
  auVar230 = maxps(auVar408,auVar419);
  fVar436 = ray->tfar;
  auVar194._4_4_ = fVar436;
  auVar194._0_4_ = fVar436;
  auVar194._8_4_ = fVar436;
  auVar194._12_4_ = fVar436;
  auVar230 = minps(auVar230,auVar194);
  auVar158 = minps(auVar158,auVar230);
  auVar195._0_4_ = -(uint)(PVar13 != (Primitive)0x0 && local_188 <= auVar158._0_4_ * 1.0000004);
  auVar195._4_4_ = -(uint)(1 < (byte)PVar13 && fStack_184 <= auVar158._4_4_ * 1.0000004);
  auVar195._8_4_ = -(uint)(2 < (byte)PVar13 && fStack_180 <= auVar158._8_4_ * 1.0000004);
  auVar195._12_4_ = -(uint)(3 < (byte)PVar13 && fStack_17c <= auVar158._12_4_ * 1.0000004);
  uVar137 = movmskps((int)(uVar129 * 0x21),auVar195);
  local_178._0_4_ = -(uint)((int)mm_lookupmask_ps._240_4_ < 0);
  local_178._4_4_ = -(uint)((int)mm_lookupmask_ps._244_4_ < 0);
  local_178._8_4_ = -(uint)((int)mm_lookupmask_ps._248_4_ < 0);
  local_178._12_4_ = 0;
  _local_358 = auVar293;
  local_348 = uVar9;
  local_290 = prim;
LAB_0038de84:
  if (uVar137 == 0) {
LAB_00390382:
    return uVar137 != 0;
  }
  lVar133 = 0;
  if (uVar137 != 0) {
    for (; (uVar137 >> lVar133 & 1) == 0; lVar133 = lVar133 + 1) {
    }
  }
  uVar138 = *(uint *)(local_290 + 2);
  uVar139 = *(uint *)(local_290 + lVar133 * 4 + 6);
  pGVar21 = (context->scene->geometries).items[uVar138].ptr;
  fVar436 = pGVar21->fnumTimeSegments;
  fVar257 = (pGVar21->time_range).lower;
  fVar304 = (((ray->dir).field_0.m128[3] - fVar257) / ((pGVar21->time_range).upper - fVar257)) *
            fVar436;
  fVar257 = floorf(fVar304);
  fVar436 = fVar436 + -1.0;
  if (fVar436 <= fVar257) {
    fVar257 = fVar436;
  }
  fVar436 = 0.0;
  if (0.0 <= fVar257) {
    fVar436 = fVar257;
  }
  fVar304 = fVar304 - fVar436;
  uVar130 = (ulong)*(uint *)(*(long *)&pGVar21->field_0x58 +
                            (ulong)uVar139 *
                            pGVar21[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  _Var22 = pGVar21[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar134 = (long)(int)fVar436 * 0x38;
  lVar23 = *(long *)(_Var22 + lVar134);
  lVar24 = *(long *)(_Var22 + 0x10 + lVar134);
  pfVar3 = (float *)(lVar23 + lVar24 * uVar130);
  fVar436 = *pfVar3;
  fVar257 = pfVar3[1];
  fVar192 = pfVar3[2];
  fVar258 = pfVar3[3];
  lVar133 = uVar130 + 1;
  pfVar3 = (float *)(lVar23 + lVar24 * lVar133);
  fVar306 = *pfVar3;
  fVar316 = pfVar3[1];
  fVar259 = pfVar3[2];
  fVar309 = pfVar3[3];
  lVar1 = uVar130 + 2;
  pfVar3 = (float *)(lVar23 + lVar24 * lVar1);
  fVar310 = *pfVar3;
  fVar313 = pfVar3[1];
  fVar338 = pfVar3[2];
  fVar339 = pfVar3[3];
  lVar2 = uVar130 + 3;
  pfVar3 = (float *)(lVar23 + lVar24 * lVar2);
  fVar347 = *pfVar3;
  fVar356 = pfVar3[1];
  fVar368 = pfVar3[2];
  fVar369 = pfVar3[3];
  lVar23 = *(long *)&pGVar21[4].fnumTimeSegments;
  lVar24 = *(long *)(lVar23 + lVar134);
  lVar25 = *(long *)(lVar23 + 0x10 + lVar134);
  pfVar3 = (float *)(lVar24 + lVar25 * uVar130);
  fVar380 = *pfVar3;
  fVar383 = pfVar3[1];
  fVar396 = pfVar3[2];
  fVar413 = pfVar3[3];
  pfVar3 = (float *)(lVar24 + lVar25 * lVar133);
  fVar417 = *pfVar3;
  fVar428 = pfVar3[1];
  fVar434 = pfVar3[2];
  fVar423 = pfVar3[3];
  pfVar3 = (float *)(lVar24 + lVar25 * lVar1);
  fVar253 = *pfVar3;
  fVar425 = pfVar3[1];
  fVar255 = pfVar3[2];
  fVar443 = pfVar3[3];
  pfVar3 = (float *)(lVar24 + lVar25 * lVar2);
  fVar446 = *pfVar3;
  fVar447 = pfVar3[1];
  fVar429 = pfVar3[2];
  fVar435 = pfVar3[3];
  fVar437 = fVar436 * 0.16666667 + fVar306 * 0.6666667 + fVar310 * 0.16666667 + fVar347 * 0.0;
  fVar438 = fVar257 * 0.16666667 + fVar316 * 0.6666667 + fVar313 * 0.16666667 + fVar356 * 0.0;
  fVar439 = fVar192 * 0.16666667 + fVar259 * 0.6666667 + fVar338 * 0.16666667 + fVar368 * 0.0;
  fVar448 = fVar258 * 0.16666667 + fVar309 * 0.6666667 + fVar339 * 0.16666667 + fVar369 * 0.0;
  fVar213 = ((fVar310 * 0.5 + fVar347 * 0.0) - fVar306 * 0.0) - fVar436 * 0.5;
  fVar241 = ((fVar313 * 0.5 + fVar356 * 0.0) - fVar316 * 0.0) - fVar257 * 0.5;
  fVar242 = ((fVar338 * 0.5 + fVar368 * 0.0) - fVar259 * 0.0) - fVar192 * 0.5;
  fVar243 = ((fVar339 * 0.5 + fVar369 * 0.0) - fVar309 * 0.0) - fVar258 * 0.5;
  fVar418 = fVar380 * 0.16666667 + fVar417 * 0.6666667 + fVar253 * 0.16666667 + fVar446 * 0.0;
  fVar424 = fVar383 * 0.16666667 + fVar428 * 0.6666667 + fVar425 * 0.16666667 + fVar447 * 0.0;
  fVar426 = fVar396 * 0.16666667 + fVar434 * 0.6666667 + fVar255 * 0.16666667 + fVar429 * 0.0;
  fVar427 = fVar413 * 0.16666667 + fVar423 * 0.6666667 + fVar443 * 0.16666667 + fVar435 * 0.0;
  fVar406 = ((fVar253 * 0.5 + fVar446 * 0.0) - fVar417 * 0.0) - fVar380 * 0.5;
  fVar414 = ((fVar425 * 0.5 + fVar447 * 0.0) - fVar428 * 0.0) - fVar383 * 0.5;
  fVar415 = ((fVar255 * 0.5 + fVar429 * 0.0) - fVar434 * 0.0) - fVar396 * 0.5;
  fVar416 = ((fVar443 * 0.5 + fVar435 * 0.0) - fVar423 * 0.0) - fVar413 * 0.5;
  fVar244 = fVar306 * 0.16666667 + fVar310 * 0.6666667 + fVar347 * 0.16666667 + fVar436 * 0.0;
  fVar252 = fVar316 * 0.16666667 + fVar313 * 0.6666667 + fVar356 * 0.16666667 + fVar257 * 0.0;
  fVar254 = fVar259 * 0.16666667 + fVar338 * 0.6666667 + fVar368 * 0.16666667 + fVar192 * 0.0;
  fVar256 = fVar309 * 0.16666667 + fVar339 * 0.6666667 + fVar369 * 0.16666667 + fVar258 * 0.0;
  fVar449 = ((fVar310 * 0.0 + fVar347 * 0.5) - fVar306 * 0.5) - fVar436 * 0.0;
  fVar209 = ((fVar313 * 0.0 + fVar356 * 0.5) - fVar316 * 0.5) - fVar257 * 0.0;
  fVar210 = ((fVar338 * 0.0 + fVar368 * 0.5) - fVar259 * 0.5) - fVar192 * 0.0;
  fVar211 = ((fVar339 * 0.0 + fVar369 * 0.5) - fVar309 * 0.5) - fVar258 * 0.0;
  fVar306 = fVar417 * 0.16666667 + fVar253 * 0.6666667 + fVar446 * 0.16666667 + fVar380 * 0.0;
  fVar316 = fVar428 * 0.16666667 + fVar425 * 0.6666667 + fVar447 * 0.16666667 + fVar383 * 0.0;
  fVar259 = fVar434 * 0.16666667 + fVar255 * 0.6666667 + fVar429 * 0.16666667 + fVar396 * 0.0;
  fVar310 = fVar423 * 0.16666667 + fVar443 * 0.6666667 + fVar435 * 0.16666667 + fVar413 * 0.0;
  fVar436 = ((fVar253 * 0.0 + fVar446 * 0.5) - fVar417 * 0.5) - fVar380 * 0.0;
  fVar257 = ((fVar425 * 0.0 + fVar447 * 0.5) - fVar428 * 0.5) - fVar383 * 0.0;
  fVar192 = ((fVar255 * 0.0 + fVar429 * 0.5) - fVar434 * 0.5) - fVar396 * 0.0;
  fVar258 = ((fVar443 * 0.0 + fVar435 * 0.5) - fVar423 * 0.5) - fVar413 * 0.0;
  fVar417 = fVar241 * fVar418 - fVar424 * fVar213;
  fVar434 = fVar242 * fVar424 - fVar426 * fVar241;
  fVar423 = fVar213 * fVar426 - fVar418 * fVar242;
  fVar253 = fVar243 * fVar427 - fVar427 * fVar243;
  fVar347 = fVar241 * fVar406 - fVar414 * fVar213;
  fVar368 = fVar242 * fVar414 - fVar415 * fVar241;
  fVar369 = fVar213 * fVar415 - fVar406 * fVar242;
  fVar309 = fVar209 * fVar306 - fVar316 * fVar449;
  fVar313 = fVar210 * fVar316 - fVar259 * fVar209;
  fVar338 = fVar449 * fVar259 - fVar306 * fVar210;
  fVar339 = fVar211 * fVar310 - fVar310 * fVar211;
  fVar306 = fVar209 * fVar436 - fVar257 * fVar449;
  fVar316 = fVar210 * fVar257 - fVar192 * fVar209;
  fVar192 = fVar449 * fVar192 - fVar436 * fVar210;
  fVar383 = fVar423 * fVar423 + fVar434 * fVar434 + fVar417 * fVar417;
  auVar158 = ZEXT416((uint)fVar383);
  auVar293 = rsqrtss(ZEXT416((uint)fVar383),auVar158);
  fVar436 = auVar293._0_4_;
  fVar396 = fVar436 * 1.5 - fVar436 * fVar436 * fVar383 * 0.5 * fVar436;
  fVar428 = fVar417 * fVar347 + fVar423 * fVar369 + fVar434 * fVar368;
  fVar436 = fVar253 * fVar396;
  auVar293 = rcpss(auVar158,auVar158);
  fVar356 = (2.0 - fVar383 * auVar293._0_4_) * auVar293._0_4_;
  fVar380 = fVar338 * fVar338 + fVar313 * fVar313 + fVar309 * fVar309;
  auVar293 = ZEXT416((uint)fVar380);
  auVar158 = rsqrtss(ZEXT416((uint)fVar380),auVar293);
  fVar257 = auVar158._0_4_;
  fVar310 = fVar257 * 1.5 - fVar257 * fVar257 * fVar380 * 0.5 * fVar257;
  fVar413 = fVar309 * fVar306 + fVar338 * fVar192 + fVar313 * fVar316;
  fVar259 = fVar339 * fVar310;
  auVar293 = rcpss(auVar293,auVar293);
  fVar257 = (2.0 - fVar380 * auVar293._0_4_) * auVar293._0_4_;
  fVar348 = fVar448 * fVar434 * fVar396;
  fVar357 = fVar448 * fVar423 * fVar396;
  fVar358 = fVar448 * fVar417 * fVar396;
  fVar359 = fVar448 * fVar436;
  fVar388 = fVar437 - fVar348;
  fVar397 = fVar438 - fVar357;
  fVar400 = fVar439 - fVar358;
  fVar403 = fVar448 - fVar359;
  fVar370 = fVar448 * fVar356 * (fVar383 * fVar368 - fVar428 * fVar434) * fVar396 +
            fVar243 * fVar434 * fVar396;
  fVar381 = fVar448 * fVar356 * (fVar383 * fVar369 - fVar428 * fVar423) * fVar396 +
            fVar243 * fVar423 * fVar396;
  fVar384 = fVar448 * fVar356 * (fVar383 * fVar347 - fVar428 * fVar417) * fVar396 +
            fVar243 * fVar417 * fVar396;
  fVar386 = fVar448 * fVar356 * (fVar383 * (fVar243 * fVar416 - fVar416 * fVar243) -
                                fVar428 * fVar253) * fVar396 + fVar243 * fVar436;
  fVar348 = fVar348 + fVar437;
  fVar357 = fVar357 + fVar438;
  fVar358 = fVar358 + fVar439;
  fVar359 = fVar359 + fVar448;
  fVar437 = fVar256 * fVar313 * fVar310;
  fVar438 = fVar256 * fVar338 * fVar310;
  fVar439 = fVar256 * fVar309 * fVar310;
  fVar448 = fVar256 * fVar259;
  fVar418 = fVar244 - fVar437;
  fVar426 = fVar252 - fVar438;
  fVar311 = fVar254 - fVar439;
  fVar314 = fVar256 - fVar448;
  fVar406 = fVar256 * fVar257 * (fVar380 * fVar316 - fVar413 * fVar313) * fVar310 +
            fVar211 * fVar313 * fVar310;
  fVar414 = fVar256 * fVar257 * (fVar380 * fVar192 - fVar413 * fVar338) * fVar310 +
            fVar211 * fVar338 * fVar310;
  fVar415 = fVar256 * fVar257 * (fVar380 * fVar306 - fVar413 * fVar309) * fVar310 +
            fVar211 * fVar309 * fVar310;
  fVar416 = fVar256 * fVar257 * (fVar380 * (fVar211 * fVar258 - fVar258 * fVar211) -
                                fVar413 * fVar339) * fVar310 + fVar211 * fVar259;
  fVar437 = fVar437 + fVar244;
  fVar438 = fVar438 + fVar252;
  fVar439 = fVar439 + fVar254;
  fVar448 = fVar448 + fVar256;
  lVar24 = *(long *)(_Var22 + 0x38 + lVar134);
  lVar25 = *(long *)(_Var22 + 0x48 + lVar134);
  pfVar3 = (float *)(lVar24 + lVar25 * uVar130);
  fVar436 = *pfVar3;
  fVar257 = pfVar3[1];
  fVar192 = pfVar3[2];
  fVar258 = pfVar3[3];
  pfVar3 = (float *)(lVar24 + lVar25 * lVar133);
  fVar306 = *pfVar3;
  fVar316 = pfVar3[1];
  fVar259 = pfVar3[2];
  fVar309 = pfVar3[3];
  pfVar3 = (float *)(lVar24 + lVar25 * lVar1);
  fVar310 = *pfVar3;
  fVar313 = pfVar3[1];
  fVar338 = pfVar3[2];
  fVar339 = pfVar3[3];
  pfVar3 = (float *)(lVar24 + lVar25 * lVar2);
  fVar347 = *pfVar3;
  fVar356 = pfVar3[1];
  fVar368 = pfVar3[2];
  fVar369 = pfVar3[3];
  lVar24 = *(long *)(lVar23 + 0x38 + lVar134);
  lVar23 = *(long *)(lVar23 + 0x48 + lVar134);
  uVar130 = uVar130 * lVar23;
  fVar389 = fVar436 * 0.16666667 + fVar306 * 0.6666667 + fVar310 * 0.16666667 + fVar347 * 0.0;
  fVar398 = fVar257 * 0.16666667 + fVar316 * 0.6666667 + fVar313 * 0.16666667 + fVar356 * 0.0;
  fVar401 = fVar192 * 0.16666667 + fVar259 * 0.6666667 + fVar338 * 0.16666667 + fVar368 * 0.0;
  fVar404 = fVar258 * 0.16666667 + fVar309 * 0.6666667 + fVar339 * 0.16666667 + fVar369 * 0.0;
  fVar244 = ((fVar310 * 0.5 + fVar347 * 0.0) - fVar306 * 0.0) - fVar436 * 0.5;
  fVar252 = ((fVar313 * 0.5 + fVar356 * 0.0) - fVar316 * 0.0) - fVar257 * 0.5;
  fVar254 = ((fVar338 * 0.5 + fVar368 * 0.0) - fVar259 * 0.0) - fVar192 * 0.5;
  fVar256 = ((fVar339 * 0.5 + fVar369 * 0.0) - fVar309 * 0.0) - fVar258 * 0.5;
  pfVar3 = (float *)(lVar24 + lVar23 * lVar2);
  fVar380 = *pfVar3;
  fVar383 = pfVar3[1];
  fVar396 = pfVar3[2];
  fVar413 = pfVar3[3];
  pfVar3 = (float *)(lVar24 + lVar1 * lVar23);
  fVar417 = *pfVar3;
  fVar428 = pfVar3[1];
  fVar434 = pfVar3[2];
  fVar423 = pfVar3[3];
  pfVar3 = (float *)(lVar24 + lVar133 * lVar23);
  fVar253 = *pfVar3;
  fVar425 = pfVar3[1];
  fVar255 = pfVar3[2];
  fVar443 = pfVar3[3];
  pfVar3 = (float *)(lVar24 + uVar130);
  fVar446 = *pfVar3;
  fVar447 = pfVar3[1];
  fVar429 = pfVar3[2];
  fVar435 = pfVar3[3];
  fVar390 = fVar446 * 0.16666667 + fVar253 * 0.6666667 + fVar417 * 0.16666667 + fVar380 * 0.0;
  fVar399 = fVar447 * 0.16666667 + fVar425 * 0.6666667 + fVar428 * 0.16666667 + fVar383 * 0.0;
  fVar402 = fVar429 * 0.16666667 + fVar255 * 0.6666667 + fVar434 * 0.16666667 + fVar396 * 0.0;
  fVar405 = fVar435 * 0.16666667 + fVar443 * 0.6666667 + fVar423 * 0.16666667 + fVar413 * 0.0;
  fVar371 = ((fVar417 * 0.5 + fVar380 * 0.0) - fVar253 * 0.0) - fVar446 * 0.5;
  fVar382 = ((fVar428 * 0.5 + fVar383 * 0.0) - fVar425 * 0.0) - fVar447 * 0.5;
  fVar385 = ((fVar434 * 0.5 + fVar396 * 0.0) - fVar255 * 0.0) - fVar429 * 0.5;
  fVar387 = ((fVar423 * 0.5 + fVar413 * 0.0) - fVar443 * 0.0) - fVar435 * 0.5;
  fVar424 = fVar306 * 0.16666667 + fVar310 * 0.6666667 + fVar347 * 0.16666667 + fVar436 * 0.0;
  fVar427 = fVar316 * 0.16666667 + fVar313 * 0.6666667 + fVar356 * 0.16666667 + fVar257 * 0.0;
  fVar312 = fVar259 * 0.16666667 + fVar338 * 0.6666667 + fVar368 * 0.16666667 + fVar192 * 0.0;
  fVar315 = fVar309 * 0.16666667 + fVar339 * 0.6666667 + fVar369 * 0.16666667 + fVar258 * 0.0;
  fVar436 = ((fVar310 * 0.0 + fVar347 * 0.5) - fVar306 * 0.5) - fVar436 * 0.0;
  fVar257 = ((fVar313 * 0.0 + fVar356 * 0.5) - fVar316 * 0.5) - fVar257 * 0.0;
  fVar192 = ((fVar338 * 0.0 + fVar368 * 0.5) - fVar259 * 0.5) - fVar192 * 0.0;
  fVar258 = ((fVar339 * 0.0 + fVar369 * 0.5) - fVar309 * 0.5) - fVar258 * 0.0;
  fVar310 = fVar253 * 0.16666667 + fVar417 * 0.6666667 + fVar380 * 0.16666667 + fVar446 * 0.0;
  fVar313 = fVar425 * 0.16666667 + fVar428 * 0.6666667 + fVar383 * 0.16666667 + fVar447 * 0.0;
  fVar338 = fVar255 * 0.16666667 + fVar434 * 0.6666667 + fVar396 * 0.16666667 + fVar429 * 0.0;
  fVar369 = fVar443 * 0.16666667 + fVar423 * 0.6666667 + fVar413 * 0.16666667 + fVar435 * 0.0;
  fVar306 = ((fVar417 * 0.0 + fVar380 * 0.5) - fVar253 * 0.5) - fVar446 * 0.0;
  fVar316 = ((fVar428 * 0.0 + fVar383 * 0.5) - fVar425 * 0.5) - fVar447 * 0.0;
  fVar259 = ((fVar434 * 0.0 + fVar396 * 0.5) - fVar255 * 0.5) - fVar429 * 0.0;
  fVar339 = ((fVar423 * 0.0 + fVar413 * 0.5) - fVar443 * 0.5) - fVar435 * 0.0;
  fVar368 = fVar252 * fVar390 - fVar399 * fVar244;
  fVar428 = fVar254 * fVar399 - fVar402 * fVar252;
  fVar423 = fVar244 * fVar402 - fVar390 * fVar254;
  fVar425 = fVar256 * fVar405 - fVar405 * fVar256;
  fVar309 = fVar252 * fVar371 - fVar382 * fVar244;
  fVar347 = fVar254 * fVar382 - fVar385 * fVar252;
  fVar356 = fVar244 * fVar385 - fVar371 * fVar254;
  fVar417 = fVar257 * fVar310 - fVar313 * fVar436;
  fVar434 = fVar192 * fVar313 - fVar338 * fVar257;
  fVar253 = fVar436 * fVar338 - fVar310 * fVar192;
  fVar255 = fVar258 * fVar369 - fVar369 * fVar258;
  fVar310 = fVar257 * fVar306 - fVar316 * fVar436;
  fVar313 = fVar192 * fVar316 - fVar259 * fVar257;
  fVar338 = fVar436 * fVar259 - fVar306 * fVar192;
  fVar306 = fVar423 * fVar423 + fVar428 * fVar428 + fVar368 * fVar368;
  auVar293 = ZEXT416((uint)fVar306);
  auVar158 = rsqrtss(ZEXT416((uint)fVar306),auVar293);
  fVar316 = auVar158._0_4_;
  fVar369 = fVar316 * 1.5 - fVar316 * fVar316 * fVar306 * 0.5 * fVar316;
  fVar443 = fVar368 * fVar309 + fVar423 * fVar356 + fVar428 * fVar347;
  auVar293 = rcpss(auVar293,auVar293);
  fVar316 = (2.0 - fVar306 * auVar293._0_4_) * auVar293._0_4_;
  fVar259 = fVar425 * fVar369;
  fVar447 = fVar253 * fVar253 + fVar434 * fVar434 + fVar417 * fVar417;
  auVar293 = ZEXT416((uint)fVar447);
  auVar158 = rsqrtss(ZEXT416((uint)fVar447),auVar293);
  fVar380 = auVar158._0_4_;
  fVar435 = fVar380 * 1.5 - fVar380 * fVar380 * fVar447 * 0.5 * fVar380;
  fVar371 = fVar417 * fVar310 + fVar253 * fVar338 + fVar434 * fVar313;
  auVar293 = rcpss(auVar293,auVar293);
  fVar382 = (2.0 - fVar447 * auVar293._0_4_) * auVar293._0_4_;
  fVar429 = fVar255 * fVar435;
  fVar380 = fVar404 * fVar428 * fVar369;
  fVar383 = fVar404 * fVar423 * fVar369;
  fVar396 = fVar404 * fVar368 * fVar369;
  fVar413 = fVar404 * fVar259;
  fVar347 = fVar404 * fVar316 * (fVar306 * fVar347 - fVar443 * fVar428) * fVar369 +
            fVar256 * fVar428 * fVar369;
  fVar356 = fVar404 * fVar316 * (fVar306 * fVar356 - fVar443 * fVar423) * fVar369 +
            fVar256 * fVar423 * fVar369;
  fVar368 = fVar404 * fVar316 * (fVar306 * fVar309 - fVar443 * fVar368) * fVar369 +
            fVar256 * fVar368 * fVar369;
  fVar369 = fVar404 * fVar316 * (fVar306 * (fVar256 * fVar387 - fVar387 * fVar256) -
                                fVar443 * fVar425) * fVar369 + fVar256 * fVar259;
  fVar428 = fVar389 - fVar380;
  fVar423 = fVar398 - fVar383;
  fVar425 = fVar401 - fVar396;
  fVar443 = fVar404 - fVar413;
  fVar380 = fVar380 + fVar389;
  fVar383 = fVar383 + fVar398;
  fVar396 = fVar396 + fVar401;
  fVar413 = fVar413 + fVar404;
  fVar306 = fVar315 * fVar434 * fVar435;
  fVar316 = fVar315 * fVar253 * fVar435;
  fVar259 = fVar315 * fVar417 * fVar435;
  fVar309 = fVar315 * fVar429;
  fVar434 = fVar315 * fVar382 * (fVar447 * fVar313 - fVar371 * fVar434) * fVar435 +
            fVar258 * fVar434 * fVar435;
  fVar253 = fVar315 * fVar382 * (fVar447 * fVar338 - fVar371 * fVar253) * fVar435 +
            fVar258 * fVar253 * fVar435;
  fVar446 = fVar315 * fVar382 * (fVar447 * fVar310 - fVar371 * fVar417) * fVar435 +
            fVar258 * fVar417 * fVar435;
  fVar255 = fVar315 * fVar382 * (fVar447 * (fVar258 * fVar339 - fVar339 * fVar258) -
                                fVar371 * fVar255) * fVar435 + fVar258 * fVar429;
  fVar310 = fVar424 - fVar306;
  fVar313 = fVar427 - fVar316;
  fVar338 = fVar312 - fVar259;
  fVar339 = fVar315 - fVar309;
  fVar306 = fVar306 + fVar424;
  fVar316 = fVar316 + fVar427;
  fVar259 = fVar259 + fVar312;
  fVar309 = fVar309 + fVar315;
  fVar417 = 1.0 - fVar304;
  local_388 = fVar388 * fVar417 + fVar428 * fVar304;
  fStack_384 = fVar397 * fVar417 + fVar423 * fVar304;
  fStack_380 = fVar400 * fVar417 + fVar425 * fVar304;
  fStack_37c = fVar403 * fVar417 + fVar443 * fVar304;
  local_398 = ((fVar213 - fVar370) * 0.33333334 + fVar388) * fVar417 +
              ((fVar244 - fVar347) * 0.33333334 + fVar428) * fVar304;
  fStack_394 = ((fVar241 - fVar381) * 0.33333334 + fVar397) * fVar417 +
               ((fVar252 - fVar356) * 0.33333334 + fVar423) * fVar304;
  fStack_390 = ((fVar242 - fVar384) * 0.33333334 + fVar400) * fVar417 +
               ((fVar254 - fVar368) * 0.33333334 + fVar425) * fVar304;
  fStack_38c = ((fVar243 - fVar386) * 0.33333334 + fVar403) * fVar417 +
               ((fVar256 - fVar369) * 0.33333334 + fVar443) * fVar304;
  local_3b8 = (fVar418 - (fVar449 - fVar406) * 0.33333334) * fVar417 +
              (fVar310 - (fVar436 - fVar434) * 0.33333334) * fVar304;
  fStack_3b4 = (fVar426 - (fVar209 - fVar414) * 0.33333334) * fVar417 +
               (fVar313 - (fVar257 - fVar253) * 0.33333334) * fVar304;
  fStack_3b0 = (fVar311 - (fVar210 - fVar415) * 0.33333334) * fVar417 +
               (fVar338 - (fVar192 - fVar446) * 0.33333334) * fVar304;
  fStack_3ac = (fVar314 - (fVar211 - fVar416) * 0.33333334) * fVar417 +
               (fVar339 - (fVar258 - fVar255) * 0.33333334) * fVar304;
  local_3a8 = fVar418 * fVar417 + fVar310 * fVar304;
  fStack_3a4 = fVar426 * fVar417 + fVar313 * fVar304;
  fStack_3a0 = fVar311 * fVar417 + fVar338 * fVar304;
  fStack_39c = fVar314 * fVar417 + fVar339 * fVar304;
  local_378 = fVar348 * fVar417 + fVar380 * fVar304;
  fStack_374 = fVar357 * fVar417 + fVar383 * fVar304;
  fStack_370 = fVar358 * fVar417 + fVar396 * fVar304;
  fStack_36c = fVar359 * fVar417 + fVar413 * fVar304;
  local_368 = ((fVar370 + fVar213) * 0.33333334 + fVar348) * fVar417 +
              ((fVar347 + fVar244) * 0.33333334 + fVar380) * fVar304;
  fStack_364 = ((fVar381 + fVar241) * 0.33333334 + fVar357) * fVar417 +
               ((fVar356 + fVar252) * 0.33333334 + fVar383) * fVar304;
  fStack_360 = ((fVar384 + fVar242) * 0.33333334 + fVar358) * fVar417 +
               ((fVar368 + fVar254) * 0.33333334 + fVar396) * fVar304;
  fStack_35c = ((fVar386 + fVar243) * 0.33333334 + fVar359) * fVar417 +
               ((fVar369 + fVar256) * 0.33333334 + fVar413) * fVar304;
  local_3c8 = (fVar437 - (fVar406 + fVar449) * 0.33333334) * fVar417 +
              (fVar306 - (fVar434 + fVar436) * 0.33333334) * fVar304;
  fStack_3c4 = (fVar438 - (fVar414 + fVar209) * 0.33333334) * fVar417 +
               (fVar316 - (fVar253 + fVar257) * 0.33333334) * fVar304;
  fStack_3c0 = (fVar439 - (fVar415 + fVar210) * 0.33333334) * fVar417 +
               (fVar259 - (fVar446 + fVar192) * 0.33333334) * fVar304;
  fStack_3bc = (fVar448 - (fVar416 + fVar211) * 0.33333334) * fVar417 +
               (fVar309 - (fVar255 + fVar258) * 0.33333334) * fVar304;
  local_218 = fVar417 * fVar437 + fVar304 * fVar306;
  fStack_214 = fVar417 * fVar438 + fVar304 * fVar316;
  fStack_210 = fVar417 * fVar439 + fVar304 * fVar259;
  fStack_20c = fVar417 * fVar448 + fVar304 * fVar309;
  fVar436 = (ray->org).field_0.m128[0];
  fVar257 = (ray->org).field_0.m128[1];
  fVar304 = (ray->org).field_0.m128[2];
  fVar192 = (pre->ray_space).vx.field_0.m128[0];
  fVar258 = (pre->ray_space).vx.field_0.m128[1];
  fVar306 = (pre->ray_space).vy.field_0.m128[0];
  fVar316 = (pre->ray_space).vy.field_0.m128[1];
  fVar259 = (pre->ray_space).vz.field_0.m128[0];
  fVar309 = (pre->ray_space).vz.field_0.m128[1];
  fVar368 = (local_388 - fVar436) * fVar192 +
            (fStack_384 - fVar257) * fVar306 + (fStack_380 - fVar304) * fVar259;
  fVar369 = (local_388 - fVar436) * fVar258 +
            (fStack_384 - fVar257) * fVar316 + (fStack_380 - fVar304) * fVar309;
  local_308._0_8_ = CONCAT44(fVar369,fVar368);
  fVar347 = (local_398 - fVar436) * fVar192 +
            (fStack_394 - fVar257) * fVar306 + (fStack_390 - fVar304) * fVar259;
  fVar356 = (local_398 - fVar436) * fVar258 +
            (fStack_394 - fVar257) * fVar316 + (fStack_390 - fVar304) * fVar309;
  local_318._0_8_ = CONCAT44(fVar356,fVar347);
  fVar310 = (local_3b8 - fVar436) * fVar192 +
            (fStack_3b4 - fVar257) * fVar306 + (fStack_3b0 - fVar304) * fVar259;
  fVar313 = (local_3b8 - fVar436) * fVar258 +
            (fStack_3b4 - fVar257) * fVar316 + (fStack_3b0 - fVar304) * fVar309;
  uStack_330 = CONCAT44(fVar313,fVar310);
  fVar338 = (local_3a8 - fVar436) * fVar192 +
            (fStack_3a4 - fVar257) * fVar306 + (fStack_3a0 - fVar304) * fVar259;
  fVar339 = (local_3a8 - fVar436) * fVar258 +
            (fStack_3a4 - fVar257) * fVar316 + (fStack_3a0 - fVar304) * fVar309;
  local_2b8 = CONCAT44(fVar339,fVar338);
  local_2c8 = (local_378 - fVar436) * fVar192 +
              (fStack_374 - fVar257) * fVar306 + (fStack_370 - fVar304) * fVar259;
  fStack_2c4 = (local_378 - fVar436) * fVar258 +
               (fStack_374 - fVar257) * fVar316 + (fStack_370 - fVar304) * fVar309;
  fVar380 = (local_368 - fVar436) * fVar192 +
            (fStack_364 - fVar257) * fVar306 + (fStack_360 - fVar304) * fVar259;
  fVar383 = (local_368 - fVar436) * fVar258 +
            (fStack_364 - fVar257) * fVar316 + (fStack_360 - fVar304) * fVar309;
  uVar407 = CONCAT44(fVar383,fVar380);
  local_2e8 = (local_3c8 - fVar436) * fVar192 +
              (fStack_3c4 - fVar257) * fVar306 + (fStack_3c0 - fVar304) * fVar259;
  fStack_2e4 = (local_3c8 - fVar436) * fVar258 +
               (fStack_3c4 - fVar257) * fVar316 + (fStack_3c0 - fVar304) * fVar309;
  fVar192 = (local_218 - fVar436) * fVar192 +
            (fStack_214 - fVar257) * fVar306 + (fStack_210 - fVar304) * fVar259;
  fVar436 = (local_218 - fVar436) * fVar258 +
            (fStack_214 - fVar257) * fVar316 + (fStack_210 - fVar304) * fVar309;
  local_2f8 = CONCAT44(fVar436,fVar192);
  _fStack_350 = uVar407;
  _local_358 = local_318._0_8_;
  local_b8._8_8_ = local_2f8;
  local_b8._0_8_ = local_2b8;
  auVar170._8_4_ = local_2c8;
  auVar170._0_8_ = local_308._0_8_;
  auVar170._12_4_ = fStack_2c4;
  auVar293 = minps(auVar170,_local_358);
  auVar196._8_4_ = local_2e8;
  auVar196._0_8_ = uStack_330;
  auVar196._12_4_ = fStack_2e4;
  auVar158 = minps(auVar196,local_b8);
  auVar293 = minps(auVar293,auVar158);
  auVar197._4_4_ = fVar369;
  auVar197._0_4_ = fVar368;
  auVar197._8_4_ = local_2c8;
  auVar197._12_4_ = fStack_2c4;
  auVar158 = maxps(auVar197,_local_358);
  auVar231._4_4_ = fVar313;
  auVar231._0_4_ = fVar310;
  auVar231._8_4_ = local_2e8;
  auVar231._12_4_ = fStack_2e4;
  auVar232 = maxps(auVar231,local_b8);
  auVar230 = maxps(auVar158,auVar232);
  auVar28._4_8_ = auVar232._8_8_;
  auVar28._0_4_ = auVar293._4_4_;
  auVar233._0_8_ = auVar28._0_8_ << 0x20;
  auVar233._8_4_ = auVar293._8_4_;
  auVar233._12_4_ = auVar293._12_4_;
  auVar234._8_8_ = auVar293._8_8_;
  auVar234._0_8_ = auVar233._8_8_;
  auVar158 = minps(auVar293,auVar234);
  auVar29._4_8_ = auVar293._8_8_;
  auVar29._0_4_ = auVar230._4_4_;
  auVar235._0_8_ = auVar29._0_8_ << 0x20;
  auVar235._8_4_ = auVar230._8_4_;
  auVar235._12_4_ = auVar230._12_4_;
  auVar236._8_8_ = auVar230._8_8_;
  auVar236._0_8_ = auVar235._8_8_;
  auVar293 = maxps(auVar230,auVar236);
  auVar171._0_8_ = auVar158._0_8_ & 0x7fffffff7fffffff;
  auVar171._8_4_ = auVar158._8_4_ & 0x7fffffff;
  auVar171._12_4_ = auVar158._12_4_ & 0x7fffffff;
  auVar198._0_8_ = auVar293._0_8_ & 0x7fffffff7fffffff;
  auVar198._8_4_ = auVar293._8_4_ & 0x7fffffff;
  auVar198._12_4_ = auVar293._12_4_ & 0x7fffffff;
  auVar293 = maxps(auVar171,auVar198);
  fStack_c4 = auVar293._4_4_;
  local_c8 = fStack_c4;
  if (fStack_c4 <= auVar293._0_4_) {
    local_c8 = auVar293._0_4_;
  }
  local_c8 = local_c8 * 9.536743e-07;
  local_308._8_8_ = local_308._0_8_;
  local_318._8_8_ = local_318._0_8_;
  register0x00001388 = local_2b8;
  register0x00001288 = uVar407;
  local_2d8 = uVar407;
  register0x00001348 = local_2f8;
  fStack_c0 = fStack_c4;
  fStack_bc = fStack_c4;
  _local_338 = CONCAT44(fStack_2c4,local_2c8);
  local_88 = fVar347 - fVar368;
  fStack_84 = fVar356 - fVar369;
  fStack_80 = fVar380 - local_2c8;
  fStack_7c = fVar383 - fStack_2c4;
  local_98 = fVar310 - fVar347;
  fStack_94 = fVar313 - fVar356;
  fStack_90 = local_2e8 - fVar380;
  fStack_8c = fStack_2e4 - fVar383;
  _local_298 = CONCAT44(fStack_2e4,local_2e8);
  local_a8 = fVar338 - fVar310;
  fStack_a4 = fVar339 - fVar313;
  fStack_a0 = fVar192 - local_2e8;
  fStack_9c = fVar436 - fStack_2e4;
  local_198 = local_378 - local_388;
  fStack_194 = fStack_374 - fStack_384;
  fStack_190 = fStack_370 - fStack_380;
  fStack_18c = fStack_36c - fStack_37c;
  local_1a8 = local_368 - local_398;
  fStack_1a4 = fStack_364 - fStack_394;
  fStack_1a0 = fStack_360 - fStack_390;
  fStack_19c = fStack_35c - fStack_38c;
  local_1b8 = local_3c8 - local_3b8;
  fStack_1b4 = fStack_3c4 - fStack_3b4;
  fStack_1b0 = fStack_3c0 - fStack_3b0;
  fStack_1ac = fStack_3bc - fStack_3ac;
  local_1c8 = local_218 - local_3a8;
  fStack_1c4 = fStack_214 - fStack_3a4;
  fStack_1c0 = fStack_210 - fStack_3a0;
  fStack_1bc = fStack_20c - fStack_39c;
  bVar135 = 0;
  uVar132 = 0;
  local_408._0_4_ = 0.0;
  local_408._4_4_ = 1.0;
  fStack_400 = 0.0;
  fStack_3fc = 0.0;
  fVar304 = 0.0;
  fVar192 = 1.0;
  local_158 = local_c8;
  fStack_154 = local_c8;
  fStack_150 = local_c8;
  fStack_14c = local_c8;
  local_168 = -local_c8;
  fStack_164 = -local_c8;
  fStack_160 = -local_c8;
  fStack_15c = -local_c8;
  fVar436 = local_2c8;
  fVar257 = fStack_2c4;
  local_348 = local_308._0_8_;
  fStack_2e0 = local_2e8;
  fStack_2dc = fStack_2e4;
  fStack_2c0 = local_2c8;
  fStack_2bc = fStack_2c4;
  local_2a8 = uStack_330;
LAB_0038ec55:
  fVar258 = 1.0 - (float)local_408._0_4_;
  fVar306 = 1.0 - (float)local_408._0_4_;
  fVar316 = 1.0 - (float)local_408._4_4_;
  fVar259 = 1.0 - (float)local_408._4_4_;
  fVar380 = local_308._0_4_ * fVar258 + local_2c8 * (float)local_408._0_4_;
  fVar434 = local_308._4_4_ * fVar306 + fStack_2c4 * (float)local_408._0_4_;
  fVar423 = local_308._8_4_ * fVar316 + fStack_2c0 * (float)local_408._4_4_;
  fVar255 = local_308._12_4_ * fVar259 + fStack_2bc * (float)local_408._4_4_;
  fVar309 = local_318._0_4_ * fVar258 + local_2d8._0_4_ * (float)local_408._0_4_;
  fVar413 = local_318._4_4_ * fVar306 + local_2d8._4_4_ * (float)local_408._0_4_;
  fVar417 = local_318._8_4_ * fVar316 + local_2d8._8_4_ * (float)local_408._4_4_;
  fVar428 = local_318._12_4_ * fVar259 + local_2d8._12_4_ * (float)local_408._4_4_;
  fVar438 = fVar436 * fVar258 + local_2e8 * (float)local_408._0_4_;
  fVar439 = fVar257 * fVar306 + fStack_2e4 * (float)local_408._0_4_;
  fVar448 = fVar310 * fVar316 + fStack_2e0 * (float)local_408._4_4_;
  fVar449 = fVar313 * fVar259 + fStack_2dc * (float)local_408._4_4_;
  fVar253 = fVar258 * local_2b8._0_4_ + (float)local_408._0_4_ * local_2f8._0_4_;
  fVar425 = fVar306 * local_2b8._4_4_ + (float)local_408._0_4_ * local_2f8._4_4_;
  fVar443 = fVar316 * local_2b8._8_4_ + (float)local_408._4_4_ * local_2f8._8_4_;
  fVar446 = fVar259 * local_2b8._12_4_ + (float)local_408._4_4_ * local_2f8._12_4_;
  fVar447 = (fVar192 - fVar304) * 0.11111111;
  local_418 = CONCAT44(fVar192,fVar304);
  fVar429 = (fVar192 - fVar304) * 0.0 + fVar304;
  fVar435 = (fVar192 - fVar304) * 0.33333334 + fVar304;
  fVar437 = (fVar192 - fVar304) * 0.6666667 + fVar304;
  fVar304 = (fVar192 - fVar304) * 1.0 + fVar304;
  fVar436 = 1.0 - fVar429;
  fVar257 = 1.0 - fVar435;
  fVar192 = 1.0 - fVar437;
  fVar259 = 1.0 - fVar304;
  fVar310 = fVar309 * fVar436 + fVar438 * fVar429;
  fVar313 = fVar309 * fVar257 + fVar438 * fVar435;
  fVar338 = fVar309 * fVar192 + fVar438 * fVar437;
  fVar339 = fVar309 * fVar259 + fVar438 * fVar304;
  fVar347 = fVar413 * fVar436 + fVar439 * fVar429;
  fVar356 = fVar413 * fVar257 + fVar439 * fVar435;
  fVar368 = fVar413 * fVar192 + fVar439 * fVar437;
  fVar369 = fVar413 * fVar259 + fVar439 * fVar304;
  fVar258 = (fVar380 * fVar436 + fVar309 * fVar429) * fVar436 + fVar429 * fVar310;
  fVar306 = (fVar380 * fVar257 + fVar309 * fVar435) * fVar257 + fVar435 * fVar313;
  fVar316 = (fVar380 * fVar192 + fVar309 * fVar437) * fVar192 + fVar437 * fVar338;
  fVar309 = (fVar380 * fVar259 + fVar309 * fVar304) * fVar259 + fVar304 * fVar339;
  fVar380 = (fVar434 * fVar436 + fVar413 * fVar429) * fVar436 + fVar429 * fVar347;
  fVar383 = (fVar434 * fVar257 + fVar413 * fVar435) * fVar257 + fVar435 * fVar356;
  fVar396 = (fVar434 * fVar192 + fVar413 * fVar437) * fVar192 + fVar437 * fVar368;
  fVar413 = (fVar434 * fVar259 + fVar413 * fVar304) * fVar259 + fVar304 * fVar369;
  fVar310 = fVar310 * fVar436 + (fVar438 * fVar436 + fVar253 * fVar429) * fVar429;
  fVar313 = fVar313 * fVar257 + (fVar438 * fVar257 + fVar253 * fVar435) * fVar435;
  fVar338 = fVar338 * fVar192 + (fVar438 * fVar192 + fVar253 * fVar437) * fVar437;
  fVar339 = fVar339 * fVar259 + (fVar438 * fVar259 + fVar253 * fVar304) * fVar304;
  fVar347 = fVar347 * fVar436 + (fVar439 * fVar436 + fVar425 * fVar429) * fVar429;
  fVar356 = fVar356 * fVar257 + (fVar439 * fVar257 + fVar425 * fVar435) * fVar435;
  fVar368 = fVar368 * fVar192 + (fVar439 * fVar192 + fVar425 * fVar437) * fVar437;
  fVar369 = fVar369 * fVar259 + (fVar439 * fVar259 + fVar425 * fVar304) * fVar304;
  local_258 = fVar436 * fVar258 + fVar429 * fVar310;
  fStack_254 = fVar257 * fVar306 + fVar435 * fVar313;
  fStack_250 = fVar192 * fVar316 + fVar437 * fVar338;
  fStack_24c = fVar259 * fVar309 + fVar304 * fVar339;
  local_148 = fVar436 * fVar380 + fVar429 * fVar347;
  fStack_144 = fVar257 * fVar383 + fVar435 * fVar356;
  fStack_140 = fVar192 * fVar396 + fVar437 * fVar368;
  fStack_13c = fVar259 * fVar413 + fVar304 * fVar369;
  fVar306 = (fVar313 - fVar306) * 3.0 * fVar447;
  fVar316 = (fVar338 - fVar316) * 3.0 * fVar447;
  fVar309 = (fVar339 - fVar309) * 3.0 * fVar447;
  fVar313 = (fVar356 - fVar383) * 3.0 * fVar447;
  fVar338 = (fVar368 - fVar396) * 3.0 * fVar447;
  fVar339 = (fVar369 - fVar413) * 3.0 * fVar447;
  local_228._4_4_ = fStack_250;
  local_228._0_4_ = fStack_254;
  local_228._8_4_ = fStack_24c;
  local_228._12_4_ = 0;
  local_e8._4_4_ = fStack_140;
  local_e8._0_4_ = fStack_144;
  local_238 = local_258 + (fVar310 - fVar258) * 3.0 * fVar447;
  fStack_234 = fStack_254 + fVar306;
  fStack_230 = fStack_250 + fVar316;
  fStack_22c = fStack_24c + fVar309;
  local_328._0_4_ = local_148 + (fVar347 - fVar380) * 3.0 * fVar447;
  local_328._4_4_ = fStack_144 + fVar313;
  fStack_320 = fStack_140 + fVar338;
  fStack_31c = fStack_13c + fVar339;
  local_248._0_4_ = fStack_254 - fVar306;
  local_248._4_4_ = fStack_250 - fVar316;
  local_248._8_4_ = fStack_24c - fVar309;
  local_248._12_4_ = 0;
  auVar172._0_4_ = fStack_144 - fVar313;
  auVar172._4_4_ = fStack_140 - fVar338;
  auVar172._8_4_ = fStack_13c - fVar339;
  auVar172._12_4_ = 0;
  fVar258 = fVar417 * fVar436 + fVar448 * fVar429;
  fVar306 = fVar417 * fVar257 + fVar448 * fVar435;
  fVar316 = fVar417 * fVar192 + fVar448 * fVar437;
  fVar309 = fVar417 * fVar259 + fVar448 * fVar304;
  fVar310 = fVar428 * fVar436 + fVar449 * fVar429;
  fVar313 = fVar428 * fVar257 + fVar449 * fVar435;
  fVar338 = fVar428 * fVar192 + fVar449 * fVar437;
  fVar434 = fVar428 * fVar259 + fVar449 * fVar304;
  fVar339 = (fVar423 * fVar436 + fVar417 * fVar429) * fVar436 + fVar429 * fVar258;
  fVar347 = (fVar423 * fVar257 + fVar417 * fVar435) * fVar257 + fVar435 * fVar306;
  fVar356 = (fVar423 * fVar192 + fVar417 * fVar437) * fVar192 + fVar437 * fVar316;
  fVar368 = (fVar423 * fVar259 + fVar417 * fVar304) * fVar259 + fVar304 * fVar309;
  fVar423 = (fVar255 * fVar436 + fVar428 * fVar429) * fVar436 + fVar429 * fVar310;
  fVar253 = (fVar255 * fVar257 + fVar428 * fVar435) * fVar257 + fVar435 * fVar313;
  fVar425 = (fVar255 * fVar192 + fVar428 * fVar437) * fVar192 + fVar437 * fVar338;
  fVar255 = (fVar255 * fVar259 + fVar428 * fVar304) * fVar259 + fVar304 * fVar434;
  fVar369 = fVar258 * fVar436 + (fVar448 * fVar436 + fVar443 * fVar429) * fVar429;
  fVar380 = fVar306 * fVar257 + (fVar448 * fVar257 + fVar443 * fVar435) * fVar435;
  fVar383 = fVar316 * fVar192 + (fVar448 * fVar192 + fVar443 * fVar437) * fVar437;
  fVar396 = fVar309 * fVar259 + (fVar448 * fVar259 + fVar443 * fVar304) * fVar304;
  fVar413 = fVar310 * fVar436 + (fVar449 * fVar436 + fVar446 * fVar429) * fVar429;
  fVar417 = fVar313 * fVar257 + (fVar449 * fVar257 + fVar446 * fVar435) * fVar435;
  fVar428 = fVar338 * fVar192 + (fVar449 * fVar192 + fVar446 * fVar437) * fVar437;
  fVar434 = fVar434 * fVar259 + (fVar449 * fVar259 + fVar446 * fVar304) * fVar304;
  fVar309 = fVar436 * fVar339 + fVar429 * fVar369;
  fVar310 = fVar257 * fVar347 + fVar435 * fVar380;
  fVar313 = fVar192 * fVar356 + fVar437 * fVar383;
  fVar338 = fVar259 * fVar368 + fVar304 * fVar396;
  fVar258 = fVar436 * fVar423 + fVar429 * fVar413;
  fVar306 = fVar257 * fVar253 + fVar435 * fVar417;
  fVar316 = fVar192 * fVar425 + fVar437 * fVar428;
  fVar259 = fVar259 * fVar255 + fVar304 * fVar434;
  fVar436 = (fVar380 - fVar347) * 3.0 * fVar447;
  fVar257 = (fVar383 - fVar356) * 3.0 * fVar447;
  fVar304 = (fVar396 - fVar368) * 3.0 * fVar447;
  fVar192 = (fVar417 - fVar253) * 3.0 * fVar447;
  fVar347 = (fVar428 - fVar425) * 3.0 * fVar447;
  fVar356 = (fVar434 - fVar255) * 3.0 * fVar447;
  local_f8._4_4_ = fVar313;
  local_f8._0_4_ = fVar310;
  local_f8._8_4_ = fVar338;
  local_f8._12_4_ = 0;
  local_118._4_4_ = fVar316;
  local_118._0_4_ = fVar306;
  local_118._8_4_ = fVar259;
  local_118._12_4_ = 0;
  local_138 = fVar309 + (fVar369 - fVar339) * 3.0 * fVar447;
  fStack_134 = fVar310 + fVar436;
  fStack_130 = fVar313 + fVar257;
  fStack_12c = fVar338 + fVar304;
  local_108 = fVar258 + (fVar413 - fVar423) * 3.0 * fVar447;
  fStack_104 = fVar306 + fVar192;
  fStack_100 = fVar316 + fVar347;
  fStack_fc = fVar259 + fVar356;
  local_d8._0_4_ = fVar310 - fVar436;
  local_d8._4_4_ = fVar313 - fVar257;
  local_d8._8_4_ = fVar338 - fVar304;
  local_d8._12_4_ = 0;
  local_128._0_4_ = fVar306 - fVar192;
  local_128._4_4_ = fVar316 - fVar347;
  local_128._8_4_ = fVar259 - fVar356;
  local_128._12_4_ = 0;
  fVar436 = (fVar310 - fStack_254) + (fVar309 - local_258);
  fVar257 = (fVar313 - fStack_250) + (fVar310 - fStack_254);
  fVar304 = (fVar338 - fStack_24c) + (fVar313 - fStack_250);
  fVar192 = (fVar338 - fStack_24c) + 0.0;
  local_e8._8_4_ = fStack_13c;
  local_e8._12_4_ = 0;
  fVar339 = (fVar306 - fStack_144) + (fVar258 - local_148);
  fVar347 = (fVar316 - fStack_140) + (fVar306 - fStack_144);
  fVar356 = (fVar259 - fStack_13c) + (fVar316 - fStack_140);
  fVar368 = (fVar259 - fStack_13c) + 0.0;
  auVar349._0_8_ =
       CONCAT44(fStack_144 * fVar257 - fStack_254 * fVar347,
                local_148 * fVar436 - local_258 * fVar339);
  auVar349._8_4_ = fStack_140 * fVar304 - fStack_250 * fVar356;
  auVar349._12_4_ = fStack_13c * fVar192 - fStack_24c * fVar368;
  auVar294._0_4_ = (float)local_328._0_4_ * fVar436 - local_238 * fVar339;
  auVar294._4_4_ = (float)local_328._4_4_ * fVar257 - fStack_234 * fVar347;
  auVar294._8_4_ = fStack_320 * fVar304 - fStack_230 * fVar356;
  auVar294._12_4_ = fStack_31c * fVar192 - fStack_22c * fVar368;
  auVar329._0_8_ =
       CONCAT44(auVar172._4_4_ * fVar257 - fVar347 * local_248._4_4_,
                auVar172._0_4_ * fVar436 - fVar339 * local_248._0_4_);
  auVar329._8_4_ = auVar172._8_4_ * fVar304 - fVar356 * local_248._8_4_;
  auVar329._12_4_ = fVar192 * 0.0 - fVar368 * 0.0;
  auVar420._0_4_ = fVar436 * fStack_144 - fVar339 * fStack_254;
  auVar420._4_4_ = fVar257 * fStack_140 - fVar347 * fStack_250;
  auVar420._8_4_ = fVar304 * fStack_13c - fVar356 * fStack_24c;
  auVar420._12_4_ = fVar192 * 0.0 - fVar368 * 0.0;
  auVar373._0_8_ =
       CONCAT44(fVar306 * fVar257 - fVar310 * fVar347,fVar258 * fVar436 - fVar309 * fVar339);
  auVar373._8_4_ = fVar316 * fVar304 - fVar313 * fVar356;
  auVar373._12_4_ = fVar259 * fVar192 - fVar338 * fVar368;
  auVar430._0_4_ = local_108 * fVar436 - local_138 * fVar339;
  auVar430._4_4_ = fStack_104 * fVar257 - fStack_134 * fVar347;
  auVar430._8_4_ = fStack_100 * fVar304 - fStack_130 * fVar356;
  auVar430._12_4_ = fStack_fc * fVar192 - fStack_12c * fVar368;
  auVar360._0_8_ =
       CONCAT44(local_128._4_4_ * fVar257 - fVar347 * local_d8._4_4_,
                local_128._0_4_ * fVar436 - fVar339 * local_d8._0_4_);
  auVar360._8_4_ = local_128._8_4_ * fVar304 - fVar356 * local_d8._8_4_;
  auVar360._12_4_ = fVar192 * 0.0 - fVar368 * 0.0;
  auVar175._0_4_ = fVar436 * fVar306 - fVar339 * fVar310;
  auVar175._4_4_ = fVar257 * fVar316 - fVar347 * fVar313;
  auVar175._8_4_ = fVar304 * fVar259 - fVar356 * fVar338;
  auVar175._12_4_ = fVar192 * 0.0 - fVar368 * 0.0;
  auVar199._8_4_ = auVar349._8_4_;
  auVar199._0_8_ = auVar349._0_8_;
  auVar199._12_4_ = auVar349._12_4_;
  auVar293 = minps(auVar199,auVar294);
  auVar230 = maxps(auVar349,auVar294);
  auVar295._8_4_ = auVar329._8_4_;
  auVar295._0_8_ = auVar329._0_8_;
  auVar295._12_4_ = auVar329._12_4_;
  auVar158 = minps(auVar295,auVar420);
  auVar293 = minps(auVar293,auVar158);
  auVar158 = maxps(auVar329,auVar420);
  auVar232 = maxps(auVar230,auVar158);
  auVar296._8_4_ = auVar373._8_4_;
  auVar296._0_8_ = auVar373._0_8_;
  auVar296._12_4_ = auVar373._12_4_;
  auVar158 = minps(auVar296,auVar430);
  auVar374 = maxps(auVar373,auVar430);
  auVar330._8_4_ = auVar360._8_4_;
  auVar330._0_8_ = auVar360._0_8_;
  auVar330._12_4_ = auVar360._12_4_;
  auVar230 = minps(auVar330,auVar175);
  auVar158 = minps(auVar158,auVar230);
  auVar293 = minps(auVar293,auVar158);
  auVar158 = maxps(auVar360,auVar175);
  auVar158 = maxps(auVar374,auVar158);
  auVar158 = maxps(auVar232,auVar158);
  bVar136 = auVar293._4_4_ <= fStack_154;
  bVar26 = auVar293._8_4_ <= fStack_150;
  bVar27 = auVar293._12_4_ <= fStack_14c;
  auVar102._4_4_ = -(uint)bVar26;
  auVar102._0_4_ = -(uint)bVar136;
  auVar102._8_4_ = -(uint)bVar27;
  auVar102._12_4_ = 0;
  auVar203 = auVar102 << 0x20;
  auVar350._0_4_ =
       -(uint)(local_168 <= auVar158._0_4_ && auVar293._0_4_ <= local_158) & local_178._0_4_;
  auVar350._4_4_ = -(uint)(fStack_164 <= auVar158._4_4_ && bVar136) & local_178._4_4_;
  auVar350._8_4_ = -(uint)(fStack_160 <= auVar158._8_4_ && bVar26) & local_178._8_4_;
  auVar350._12_4_ = -(uint)(fStack_15c <= auVar158._12_4_ && bVar27) & local_178._12_4_;
  uVar139 = movmskps((int)uVar130,auVar350);
  uVar130 = (ulong)uVar139;
  if (uVar139 != 0) {
    fVar436 = (fVar310 - fVar309) + (fStack_254 - local_258);
    fVar257 = (fVar313 - fVar310) + (fStack_250 - fStack_254);
    fVar304 = (fVar338 - fVar313) + (fStack_24c - fStack_250);
    fVar192 = (0.0 - fVar338) + (0.0 - fStack_24c);
    fVar339 = (fVar306 - fVar258) + (fStack_144 - local_148);
    fVar347 = (fVar316 - fVar306) + (fStack_140 - fStack_144);
    fVar356 = (fVar259 - fVar316) + (fStack_13c - fStack_140);
    fVar368 = (0.0 - fVar259) + (0.0 - fStack_13c);
    auVar440._0_8_ =
         CONCAT44(fStack_144 * fVar257 - fStack_254 * fVar347,
                  local_148 * fVar436 - local_258 * fVar339);
    auVar440._8_4_ = fStack_140 * fVar304 - fStack_250 * fVar356;
    auVar440._12_4_ = fStack_13c * fVar192 - fStack_24c * fVar368;
    auVar297._0_4_ = (float)local_328._0_4_ * fVar436 - local_238 * fVar339;
    auVar297._4_4_ = (float)local_328._4_4_ * fVar257 - fStack_234 * fVar347;
    auVar297._8_4_ = fStack_320 * fVar304 - fStack_230 * fVar356;
    auVar297._12_4_ = fStack_31c * fVar192 - fStack_22c * fVar368;
    auVar361._0_8_ =
         CONCAT44(auVar172._4_4_ * fVar257 - local_248._4_4_ * fVar347,
                  auVar172._0_4_ * fVar436 - local_248._0_4_ * fVar339);
    auVar361._8_4_ = auVar172._8_4_ * fVar304 - local_248._8_4_ * fVar356;
    auVar361._12_4_ = fVar192 * 0.0 - fVar368 * 0.0;
    auVar331._0_4_ = fStack_144 * fVar436 - fStack_254 * fVar339;
    auVar331._4_4_ = fStack_140 * fVar257 - fStack_250 * fVar347;
    auVar331._8_4_ = fStack_13c * fVar304 - fStack_24c * fVar356;
    auVar331._12_4_ = fVar192 * 0.0 - fVar368 * 0.0;
    auVar237._0_8_ =
         CONCAT44(fVar306 * fVar257 - fVar310 * fVar347,fVar258 * fVar436 - fVar309 * fVar339);
    auVar237._8_4_ = fVar316 * fVar304 - fVar313 * fVar356;
    auVar237._12_4_ = fVar259 * fVar192 - fVar338 * fVar368;
    auVar391._0_4_ = local_108 * fVar436 - local_138 * fVar339;
    auVar391._4_4_ = fStack_104 * fVar257 - fStack_134 * fVar347;
    auVar391._8_4_ = fStack_100 * fVar304 - fStack_130 * fVar356;
    auVar391._12_4_ = fStack_fc * fVar192 - fStack_12c * fVar368;
    auVar421._0_8_ =
         CONCAT44(local_128._4_4_ * fVar257 - local_d8._4_4_ * fVar347,
                  local_128._0_4_ * fVar436 - local_d8._0_4_ * fVar339);
    auVar421._8_4_ = local_128._8_4_ * fVar304 - local_d8._8_4_ * fVar356;
    auVar421._12_4_ = fVar192 * 0.0 - fVar368 * 0.0;
    auVar175._0_4_ = fVar436 * fVar306 - fVar339 * fVar310;
    auVar175._4_4_ = fVar257 * fVar316 - fVar347 * fVar313;
    auVar175._8_4_ = fVar304 * fVar259 - fVar356 * fVar338;
    auVar175._12_4_ = fVar192 * 0.0 - fVar368 * 0.0;
    auVar200._8_4_ = auVar440._8_4_;
    auVar200._0_8_ = auVar440._0_8_;
    auVar200._12_4_ = auVar440._12_4_;
    auVar293 = minps(auVar200,auVar297);
    auVar230 = maxps(auVar440,auVar297);
    auVar298._8_4_ = auVar361._8_4_;
    auVar298._0_8_ = auVar361._0_8_;
    auVar298._12_4_ = auVar361._12_4_;
    auVar158 = minps(auVar298,auVar331);
    auVar293 = minps(auVar293,auVar158);
    auVar158 = maxps(auVar361,auVar331);
    auVar374 = maxps(auVar230,auVar158);
    auVar299._8_4_ = auVar237._8_4_;
    auVar299._0_8_ = auVar237._0_8_;
    auVar299._12_4_ = auVar237._12_4_;
    auVar230 = minps(auVar299,auVar391);
    auVar158 = maxps(auVar237,auVar391);
    auVar332._8_4_ = auVar421._8_4_;
    auVar332._0_8_ = auVar421._0_8_;
    auVar332._12_4_ = auVar421._12_4_;
    auVar232 = minps(auVar332,auVar175);
    auVar230 = minps(auVar230,auVar232);
    auVar293 = minps(auVar293,auVar230);
    auVar230 = maxps(auVar421,auVar175);
    auVar158 = maxps(auVar158,auVar230);
    auVar158 = maxps(auVar374,auVar158);
    bVar136 = auVar293._4_4_ <= fStack_154;
    bVar26 = auVar293._8_4_ <= fStack_150;
    bVar27 = auVar293._12_4_ <= fStack_14c;
    auVar103._4_4_ = -(uint)bVar26;
    auVar103._0_4_ = -(uint)bVar136;
    auVar103._8_4_ = -(uint)bVar27;
    auVar103._12_4_ = 0;
    auVar203 = auVar103 << 0x20;
    auVar441._0_4_ =
         -(uint)(local_168 <= auVar158._0_4_ && auVar293._0_4_ <= local_158) & auVar350._0_4_;
    auVar441._4_4_ = -(uint)(fStack_164 <= auVar158._4_4_ && bVar136) & auVar350._4_4_;
    auVar441._8_4_ = -(uint)(fStack_160 <= auVar158._8_4_ && bVar26) & auVar350._8_4_;
    auVar441._12_4_ = -(uint)(fStack_15c <= auVar158._12_4_ && bVar27) & auVar350._12_4_;
    uVar139 = movmskps(uVar139,auVar441);
    uVar130 = (ulong)uVar139;
    auVar430 = local_118;
    if (uVar139 != 0) {
      uVar130 = (ulong)(byte)uVar139;
      auStack_208[uVar132] = uVar139 & 0xff;
      *(undefined8 *)(afStack_78 + uVar132 * 2) = local_418;
      *(undefined1 (*) [8])(afStack_58 + uVar132 * 2) = local_408;
      uVar132 = (ulong)((int)uVar132 + 1);
      auVar175 = _local_408;
    }
  }
LAB_0038f2b6:
  _local_3f8 = auVar172;
  auVar293 = _local_3f8;
  if ((int)uVar132 == 0) {
    if (bVar135 != 0) goto LAB_00390382;
    fVar436 = ray->tfar;
    auVar208._4_4_ = -(uint)(fStack_184 <= fVar436);
    auVar208._0_4_ = -(uint)(local_188 <= fVar436);
    auVar208._8_4_ = -(uint)(fStack_180 <= fVar436);
    auVar208._12_4_ = -(uint)(fStack_17c <= fVar436);
    uVar138 = movmskps((int)uVar130,auVar208);
    uVar137 = uVar137 & uVar137 + 0xf & uVar138;
    goto LAB_0038de84;
  }
  uVar140 = (int)uVar132 - 1;
  uVar130 = (ulong)uVar140;
  uVar139 = auStack_208[uVar130];
  local_408._0_4_ = afStack_58[uVar130 * 2];
  local_408._4_4_ = afStack_58[uVar130 * 2 + 1];
  fStack_400 = 0.0;
  fStack_3fc = 0.0;
  uVar10 = 0;
  if (uVar139 != 0) {
    for (; (uVar139 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
    }
  }
  uVar139 = uVar139 - 1 & uVar139;
  auStack_208[uVar130] = uVar139;
  if (uVar139 == 0) {
    uVar132 = (ulong)uVar140;
  }
  fVar192 = (float)(uVar10 + 1) * 0.33333334;
  fVar258 = auVar175._4_4_ * 0.0;
  fVar306 = auVar203._4_4_ * 0.0;
  fVar436 = afStack_78[uVar130 * 2];
  fVar257 = afStack_78[uVar130 * 2 + 1];
  fVar304 = fVar436 * (1.0 - (float)uVar10 * 0.33333334) + fVar257 * (float)uVar10 * 0.33333334;
  fVar192 = fVar436 * (1.0 - fVar192) + fVar257 * fVar192;
  fVar316 = fVar436 * (0.0 - fVar258) + fVar257 * fVar258;
  fVar306 = fVar436 * (0.0 - fVar306) + fVar257 * fVar306;
  fVar258 = fVar192 - fVar304;
  fVar436 = local_338;
  fVar257 = fStack_334;
  fVar310 = (float)uStack_330;
  fVar313 = uStack_330._4_4_;
  if (fVar258 < 0.16666667) {
    fVar356 = 1.0 - (float)local_408._0_4_;
    fVar369 = 1.0 - (float)local_408._0_4_;
    fVar396 = 1.0 - (float)local_408._4_4_;
    fVar413 = 1.0 - (float)local_408._4_4_;
    fVar347 = local_308._0_4_ * fVar356 + local_2c8 * (float)local_408._0_4_;
    fVar368 = local_308._4_4_ * fVar369 + fStack_2c4 * (float)local_408._0_4_;
    fVar380 = local_308._8_4_ * fVar396 + fStack_2c0 * (float)local_408._4_4_;
    fVar383 = local_308._12_4_ * fVar413 + fStack_2bc * (float)local_408._4_4_;
    fVar259 = local_318._0_4_ * fVar356 + (float)local_2d8._0_4_ * (float)local_408._0_4_;
    fVar309 = local_318._4_4_ * fVar369 + (float)local_2d8._4_4_ * (float)local_408._0_4_;
    fVar338 = local_318._8_4_ * fVar396 + fStack_2d0 * (float)local_408._4_4_;
    fVar339 = local_318._12_4_ * fVar413 + fStack_2cc * (float)local_408._4_4_;
    fVar253 = local_338 * fVar356 + local_2e8 * (float)local_408._0_4_;
    fVar255 = fStack_334 * fVar369 + fStack_2e4 * (float)local_408._0_4_;
    fVar446 = (float)uStack_330 * fVar396 + fStack_2e0 * (float)local_408._4_4_;
    fVar429 = uStack_330._4_4_ * fVar413 + fStack_2dc * (float)local_408._4_4_;
    fVar417 = (fVar356 * (float)local_2b8._0_4_ + (float)local_408._0_4_ * (float)local_2f8._0_4_) -
              fVar253;
    fVar428 = (fVar369 * (float)local_2b8._4_4_ + (float)local_408._0_4_ * (float)local_2f8._4_4_) -
              fVar255;
    fVar434 = (fVar396 * fStack_2b0 + (float)local_408._4_4_ * fStack_2f0) - fVar446;
    fVar423 = (fVar413 * fStack_2ac + (float)local_408._4_4_ * fStack_2ec) - fVar429;
    fVar356 = fVar304 * (fVar253 - fVar259) + fVar259;
    fVar369 = fVar304 * (fVar255 - fVar309) + fVar309;
    fVar396 = fVar304 * (fVar446 - fVar338) + fVar338;
    fVar413 = fVar304 * (fVar429 - fVar339) + fVar339;
    fVar425 = (fVar253 - fVar259) * fVar192 + fVar259;
    fVar443 = (fVar255 - fVar309) * fVar192 + fVar309;
    fVar447 = (fVar446 - fVar338) * fVar192 + fVar338;
    fVar435 = (fVar429 - fVar339) * fVar192 + fVar339;
    fVar437 = fVar304 * (fVar259 - fVar347) + fVar347;
    fVar438 = fVar304 * (fVar309 - fVar368) + fVar368;
    fVar439 = fVar304 * (fVar338 - fVar380) + fVar380;
    fVar448 = fVar304 * (fVar339 - fVar383) + fVar383;
    fVar437 = (fVar356 - fVar437) * fVar304 + fVar437;
    fVar438 = (fVar369 - fVar438) * fVar304 + fVar438;
    fVar439 = (fVar396 - fVar439) * fVar304 + fVar439;
    fVar448 = (fVar413 - fVar448) * fVar304 + fVar448;
    fVar356 = (((fVar304 * fVar417 + fVar253) - fVar356) * fVar304 + fVar356) - fVar437;
    fVar369 = (((fVar304 * fVar428 + fVar255) - fVar369) * fVar304 + fVar369) - fVar438;
    fVar396 = (((fVar304 * fVar434 + fVar446) - fVar396) * fVar304 + fVar396) - fVar439;
    fVar413 = (((fVar304 * fVar423 + fVar429) - fVar413) * fVar304 + fVar413) - fVar448;
    auVar238._0_4_ = fVar304 * fVar356 + fVar437;
    auVar238._4_4_ = fVar304 * fVar369 + fVar438;
    auVar238._8_4_ = fVar304 * fVar396 + fVar439;
    auVar238._12_4_ = fVar304 * fVar413 + fVar448;
    fVar347 = (fVar259 - fVar347) * fVar192 + fVar347;
    fVar368 = (fVar309 - fVar368) * fVar192 + fVar368;
    fVar380 = (fVar338 - fVar380) * fVar192 + fVar380;
    fVar383 = (fVar339 - fVar383) * fVar192 + fVar383;
    fVar347 = (fVar425 - fVar347) * fVar192 + fVar347;
    fVar368 = (fVar443 - fVar368) * fVar192 + fVar368;
    fVar380 = (fVar447 - fVar380) * fVar192 + fVar380;
    fVar383 = (fVar435 - fVar383) * fVar192 + fVar383;
    fVar309 = (((fVar417 * fVar192 + fVar253) - fVar425) * fVar192 + fVar425) - fVar347;
    fVar338 = (((fVar428 * fVar192 + fVar255) - fVar443) * fVar192 + fVar443) - fVar368;
    fVar339 = (((fVar434 * fVar192 + fVar446) - fVar447) * fVar192 + fVar447) - fVar380;
    fVar443 = (((fVar423 * fVar192 + fVar429) - fVar435) * fVar192 + fVar435) - fVar383;
    fVar347 = fVar192 * fVar309 + fVar347;
    fVar368 = fVar192 * fVar338 + fVar368;
    fVar380 = fVar192 * fVar339 + fVar380;
    fVar383 = fVar192 * fVar443 + fVar383;
    fVar259 = fVar258 * 0.33333334;
    fVar417 = fVar356 * (float)DAT_01f4afa0 * fVar259 + auVar238._0_4_;
    fVar428 = fVar369 * DAT_01f4afa0._4_4_ * fVar259 + auVar238._4_4_;
    fVar434 = fVar396 * DAT_01f4afa0._8_4_ * fVar259 + auVar238._8_4_;
    fVar423 = fVar413 * DAT_01f4afa0._12_4_ * fVar259 + auVar238._12_4_;
    fVar253 = fVar347 - fVar259 * fVar309 * (float)DAT_01f4afa0;
    fVar425 = fVar368 - fVar259 * fVar338 * DAT_01f4afa0._4_4_;
    fVar255 = fVar380 - fVar259 * fVar339 * DAT_01f4afa0._8_4_;
    fVar443 = fVar383 - fVar259 * fVar443 * DAT_01f4afa0._12_4_;
    auVar30._4_8_ = auVar430._8_8_;
    auVar30._0_4_ = auVar238._4_4_;
    auVar431._0_8_ = auVar30._0_8_ << 0x20;
    auVar431._8_4_ = auVar238._8_4_;
    auVar431._12_4_ = auVar238._12_4_;
    auVar432._8_8_ = auVar238._8_8_;
    auVar432._0_8_ = auVar431._8_8_;
    auVar31._4_8_ = DAT_01f4afa0._8_8_;
    auVar31._0_4_ = fVar368;
    auVar362._0_8_ = auVar31._0_8_ << 0x20;
    auVar362._8_4_ = fVar380;
    auVar362._12_4_ = fVar383;
    fVar356 = (fVar380 - fVar347) + (auVar238._8_4_ - auVar238._0_4_);
    fVar369 = (fVar383 - fVar368) + (auVar238._12_4_ - auVar238._4_4_);
    auVar375._0_4_ = fVar425 * fVar369;
    auVar375._4_4_ = fVar425 * fVar369;
    auVar375._8_4_ = fVar443 * fVar369;
    auVar375._12_4_ = fVar443 * fVar369;
    fVar259 = auVar238._0_4_ * fVar356 + auVar238._4_4_ * fVar369;
    fVar309 = auVar238._8_4_ * fVar356 + auVar238._12_4_ * fVar369;
    fVar396 = fVar417 * fVar356 + fVar428 * fVar369;
    fVar413 = fVar434 * fVar356 + fVar423 * fVar369;
    fVar446 = fVar253 * fVar356 + auVar375._0_4_;
    auVar351._0_8_ = CONCAT44(fVar425 * fVar356 + auVar375._4_4_,fVar446);
    auVar351._8_4_ = fVar255 * fVar356 + auVar375._8_4_;
    auVar351._12_4_ = fVar443 * fVar356 + auVar375._12_4_;
    fVar339 = fVar356 * fVar347 + fVar369 * fVar368;
    fVar447 = fVar356 * fVar380 + fVar369 * fVar383;
    auVar32._4_8_ = auVar375._8_8_;
    auVar32._0_4_ = fVar428 * fVar356 + fVar428 * fVar369;
    auVar376._0_8_ = auVar32._0_8_ << 0x20;
    auVar376._8_4_ = fVar413;
    auVar376._12_4_ = fVar423 * fVar356 + fVar423 * fVar369;
    fVar338 = fVar396;
    if (fVar396 <= fVar259) {
      fVar338 = fVar259;
      fVar259 = fVar396;
    }
    auVar377._8_8_ = auVar376._8_8_;
    auVar377._0_8_ = auVar377._8_8_;
    auVar173._8_4_ = auVar351._8_4_;
    auVar173._0_8_ = auVar351._0_8_;
    auVar173._12_4_ = auVar351._12_4_;
    if (fVar339 <= fVar446) {
      auVar173._0_4_ = fVar339;
    }
    if (auVar173._0_4_ <= fVar259) {
      fVar259 = auVar173._0_4_;
    }
    auVar33._4_8_ = auVar173._8_8_;
    auVar33._0_4_ = fVar356 * fVar368 + fVar369 * fVar368;
    auVar174._0_8_ = auVar33._0_8_ << 0x20;
    auVar174._8_4_ = fVar447;
    auVar174._12_4_ = fVar356 * fVar383 + fVar369 * fVar383;
    if (fVar339 <= fVar446) {
      fVar339 = fVar446;
    }
    auVar175._8_8_ = auVar174._8_8_;
    auVar175._0_8_ = auVar175._8_8_;
    if (fVar339 <= fVar338) {
      fVar339 = fVar338;
    }
    if (fVar413 <= fVar309) {
      auVar377._0_4_ = fVar309;
      fVar309 = fVar413;
    }
    auVar201._8_4_ = auVar351._8_4_;
    auVar201._0_8_ = auVar351._8_8_;
    auVar201._12_4_ = auVar351._12_4_;
    if (fVar447 <= auVar351._8_4_) {
      auVar201._0_4_ = fVar447;
    }
    if (auVar201._0_4_ <= fVar309) {
      fVar309 = auVar201._0_4_;
    }
    if (fVar447 <= auVar351._8_4_) {
      auVar175._0_4_ = auVar351._8_4_;
    }
    if (auVar175._0_4_ <= auVar377._0_4_) {
      auVar175._0_4_ = auVar377._0_4_;
    }
    bVar136 = 3 < (uint)uVar132;
    uVar34 = (undefined3)(uVar140 >> 8);
    uVar130 = (ulong)CONCAT31(uVar34,bVar136);
    fVar338 = auVar175._0_4_;
    if ((0.0001 <= fVar259) || (fVar338 <= -0.0001)) goto LAB_0038f5cc;
    goto LAB_0038f615;
  }
  goto LAB_0038ec55;
LAB_0038f5cc:
  auVar203._0_12_ = ZEXT812(0x38d1b717);
  auVar203._12_4_ = 0.0;
  if ((0.0001 <= fVar309 || fVar339 <= -0.0001) &&
     ((0.0001 <= fVar259 || fVar339 <= -0.0001 &&
      (auVar430 = auVar432, auVar172 = _local_3f8, 0.0001 <= fVar309 || fVar338 <= -0.0001))))
  goto LAB_0038f2b6;
LAB_0038f615:
  _local_3f8 = auVar362._8_8_;
  auVar172 = _local_3f8;
  bVar136 = bVar136 || fVar258 < 0.001;
  uVar130 = (ulong)CONCAT31(uVar34,bVar136);
  fVar369 = (float)(~-(uint)(fVar259 < 0.0) & 0x3f800000 | -(uint)(fVar259 < 0.0) & 0xbf800000);
  fVar396 = (float)(~-(uint)(fVar339 < 0.0) & 0x3f800000 | -(uint)(fVar339 < 0.0) & 0xbf800000);
  fVar356 = 0.0;
  if ((fVar369 == fVar396) && (!NAN(fVar369) && !NAN(fVar396))) {
    fVar356 = INFINITY;
  }
  fVar413 = 0.0;
  if ((fVar369 == fVar396) && (!NAN(fVar369) && !NAN(fVar396))) {
    fVar413 = -INFINITY;
  }
  fVar446 = (float)(~-(uint)(fVar309 < 0.0) & 0x3f800000 | -(uint)(fVar309 < 0.0) & 0xbf800000);
  if ((fVar369 != fVar446) || (fVar447 = fVar413, NAN(fVar369) || NAN(fVar446))) {
    if ((fVar309 != fVar259) || (NAN(fVar309) || NAN(fVar259))) {
      fVar309 = -fVar259 / (fVar309 - fVar259);
      fVar309 = (1.0 - fVar309) * 0.0 + fVar309;
      fVar447 = fVar309;
    }
    else {
      fVar309 = 0.0;
      if ((fVar259 != 0.0) || (fVar447 = 1.0, NAN(fVar259))) {
        fVar309 = INFINITY;
        fVar447 = -INFINITY;
      }
    }
    if (fVar309 <= fVar356) {
      fVar356 = fVar309;
    }
    if (fVar447 <= fVar413) {
      fVar447 = fVar413;
    }
  }
  fVar259 = *(float *)(&DAT_01f4bed4 + (ulong)(fVar338 < 0.0) * 4);
  if ((fVar396 != fVar259) || (fVar309 = fVar447, NAN(fVar396) || NAN(fVar259))) {
    if ((fVar338 != fVar339) || (NAN(fVar338) || NAN(fVar339))) {
      fVar369 = -fVar339 / (fVar338 - fVar339);
      fVar369 = (1.0 - fVar369) * 0.0 + fVar369;
      fVar309 = fVar369;
    }
    else {
      fVar369 = 0.0;
      if ((fVar339 != 0.0) || (fVar309 = 1.0, NAN(fVar339))) {
        fVar369 = INFINITY;
        fVar309 = -INFINITY;
      }
    }
    if (fVar369 <= fVar356) {
      fVar356 = fVar369;
    }
    if (fVar309 <= fVar447) {
      fVar309 = fVar447;
    }
  }
  if ((fVar446 != fVar259) || (NAN(fVar446) || NAN(fVar259))) {
    fVar356 = (float)(~-(uint)(fVar356 < 1.0) & 0x3f800000 | (uint)fVar356 & -(uint)(fVar356 < 1.0))
    ;
    fVar309 = (float)(~-(uint)(fVar309 < 1.0) & (uint)fVar309 | -(uint)(fVar309 < 1.0) & 0x3f800000)
    ;
  }
  auVar430._0_12_ = ZEXT812(0x3f800000);
  auVar430._12_4_ = 0.0;
  auVar202._0_8_ =
       CONCAT44(~-(uint)(fVar309 < 1.0),~-(uint)(fVar356 < 0.0) & (uint)fVar356) &
       0x3f800000ffffffff;
  auVar202._8_8_ = 0;
  auVar203 = auVar202 | ZEXT416((uint)fVar309 & -(uint)(fVar309 < 1.0)) << 0x20;
  fVar259 = auVar203._4_4_;
  auVar175._4_4_ = fVar259;
  auVar175._0_4_ = fVar259;
  auVar175._8_4_ = fVar259;
  auVar175._12_4_ = fVar259;
  fStack_3f0 = auVar293._8_4_;
  fStack_3ec = auVar293._12_4_;
  _local_328 = auVar432;
  if (fVar259 < auVar203._0_4_) goto LAB_0038f2b6;
  fVar309 = auVar203._0_4_ + -0.1;
  fVar339 = auVar203._8_4_ + 0.0;
  fVar356 = auVar203._12_4_ + 0.0;
  uVar139 = -(uint)(fVar259 + 0.1 < 1.0);
  fVar309 = (float)(~-(uint)(fVar309 < 0.0) & (uint)fVar309);
  fVar259 = (float)(~uVar139 & 0x3f800000 | (uint)(fVar259 + 0.1) & uVar139);
  fVar435 = 1.0 - fVar309;
  fVar437 = 1.0 - fVar309;
  fVar438 = 1.0 - fVar259;
  fVar439 = 1.0 - fVar259;
  fVar369 = auVar238._0_4_ * fVar435 + auVar238._8_4_ * fVar309;
  fVar396 = auVar238._4_4_ * fVar437 + auVar238._12_4_ * fVar309;
  fVar413 = auVar238._0_4_ * fVar438 + auVar238._8_4_ * fVar259;
  fVar446 = auVar238._4_4_ * fVar439 + auVar238._12_4_ * fVar259;
  fVar447 = fVar417 * fVar435 + fVar434 * fVar309;
  fVar429 = fVar428 * fVar437 + fVar423 * fVar309;
  fVar417 = fVar417 * fVar438 + fVar434 * fVar259;
  fVar428 = fVar428 * fVar439 + fVar423 * fVar259;
  fVar434 = fVar253 * fVar435 + fVar255 * fVar309;
  fVar423 = fVar425 * fVar437 + fVar443 * fVar309;
  fVar253 = fVar253 * fVar438 + fVar255 * fVar259;
  fVar425 = fVar425 * fVar439 + fVar443 * fVar259;
  fVar380 = fVar435 * fVar347 + fVar380 * fVar309;
  fVar383 = fVar437 * fVar368 + fVar383 * fVar309;
  fVar255 = fVar438 * fVar347 + fStack_3f0 * fVar259;
  fVar443 = fVar439 * fVar368 + fStack_3ec * fVar259;
  fVar347 = (float)local_408._4_4_ * fVar339;
  fVar368 = (float)local_408._4_4_ * fVar356;
  fVar435 = (float)local_408._0_4_ * (1.0 - fVar259);
  fStack_400 = (float)local_408._0_4_ * (0.0 - fVar339);
  fStack_3fc = (float)local_408._0_4_ * (0.0 - fVar356);
  local_408._0_4_ = (float)local_408._0_4_ * (1.0 - fVar309) + (float)local_408._4_4_ * fVar309;
  local_408._4_4_ = fVar435 + (float)local_408._4_4_ * fVar259;
  fStack_400 = fStack_400 + fVar347;
  fStack_3fc = fStack_3fc + fVar368;
  fVar258 = 1.0 / fVar258;
  auVar204._0_4_ = fVar255 - fVar380;
  auVar204._4_4_ = fVar443 - fVar383;
  auVar204._8_4_ = fVar255 - fVar255;
  auVar204._12_4_ = fVar443 - fVar443;
  auVar249._0_8_ = CONCAT44(fVar425 - fVar423,fVar253 - fVar434);
  auVar249._8_4_ = fVar253 - fVar253;
  auVar249._12_4_ = fVar425 - fVar425;
  auVar333._0_4_ = fVar417 - fVar447;
  auVar333._4_4_ = fVar428 - fVar429;
  auVar333._8_4_ = fVar417 - fVar417;
  auVar333._12_4_ = fVar428 - fVar428;
  auVar378._0_8_ = CONCAT44((fVar429 - fVar396) * 3.0,(fVar447 - fVar369) * 3.0);
  auVar378._8_4_ = (fVar417 - fVar413) * 3.0;
  auVar378._12_4_ = (fVar428 - fVar446) * 3.0;
  auVar300._0_8_ = CONCAT44((fVar423 - fVar429) * 3.0,(fVar434 - fVar447) * 3.0);
  auVar300._8_4_ = (fVar253 - fVar417) * 3.0;
  auVar300._12_4_ = (fVar425 - fVar428) * 3.0;
  auVar409._0_4_ = (fVar380 - fVar434) * 3.0;
  auVar409._4_4_ = (fVar383 - fVar423) * 3.0;
  auVar409._8_4_ = (fVar255 - fVar253) * 3.0;
  auVar409._12_4_ = (fVar443 - fVar425) * 3.0;
  auVar352._8_4_ = auVar300._8_4_;
  auVar352._0_8_ = auVar300._0_8_;
  auVar352._12_4_ = auVar300._12_4_;
  auVar158 = minps(auVar352,auVar409);
  auVar293 = maxps(auVar300,auVar409);
  auVar392._8_4_ = auVar378._8_4_;
  auVar392._0_8_ = auVar378._0_8_;
  auVar392._12_4_ = auVar378._12_4_;
  auVar232 = minps(auVar392,auVar158);
  auVar230 = maxps(auVar378,auVar293);
  auVar35._4_8_ = auVar293._8_8_;
  auVar35._0_4_ = auVar232._4_4_;
  auVar301._0_8_ = auVar35._0_8_ << 0x20;
  auVar301._8_4_ = auVar232._8_4_;
  auVar301._12_4_ = auVar232._12_4_;
  auVar302._8_8_ = auVar232._8_8_;
  auVar302._0_8_ = auVar301._8_8_;
  auVar36._4_8_ = auVar158._8_8_;
  auVar36._0_4_ = auVar230._4_4_;
  auVar353._0_8_ = auVar36._0_8_ << 0x20;
  auVar353._8_4_ = auVar230._8_4_;
  auVar353._12_4_ = auVar230._12_4_;
  auVar354._8_8_ = auVar230._8_8_;
  auVar354._0_8_ = auVar353._8_8_;
  auVar158 = minps(auVar232,auVar302);
  auVar293 = maxps(auVar230,auVar354);
  fVar437 = auVar158._0_4_ * fVar258;
  fVar438 = auVar158._4_4_ * fVar258;
  fVar439 = auVar158._8_4_ * fVar258;
  fVar448 = auVar158._12_4_ * fVar258;
  fVar428 = fVar258 * auVar293._0_4_;
  fVar423 = fVar258 * auVar293._4_4_;
  fVar425 = fVar258 * auVar293._8_4_;
  fVar258 = fVar258 * auVar293._12_4_;
  fVar429 = 1.0 / ((float)local_408._4_4_ - (float)local_408._0_4_);
  auVar176._0_8_ = CONCAT44(fVar446 - fVar396,fVar413 - fVar369);
  auVar176._8_4_ = fVar413 - fVar413;
  auVar176._12_4_ = fVar446 - fVar446;
  auVar363._8_4_ = auVar176._8_4_;
  auVar363._0_8_ = auVar176._0_8_;
  auVar363._12_4_ = auVar176._12_4_;
  auVar230 = minps(auVar363,auVar333);
  auVar293 = maxps(auVar176,auVar333);
  auVar239._8_4_ = auVar249._8_4_;
  auVar239._0_8_ = auVar249._0_8_;
  auVar239._12_4_ = auVar249._12_4_;
  auVar158 = minps(auVar239,auVar204);
  auVar230 = minps(auVar230,auVar158);
  auVar158 = maxps(auVar249,auVar204);
  auVar293 = maxps(auVar293,auVar158);
  fVar446 = auVar230._0_4_ * fVar429;
  fVar447 = auVar230._4_4_ * fVar429;
  fVar435 = fVar429 * auVar293._0_4_;
  fVar429 = fVar429 * auVar293._4_4_;
  stack0xfffffffffffffc0c = local_408._0_4_;
  local_3f8._0_4_ = fVar304;
  fStack_3f0 = fVar192;
  fStack_3ec = (float)local_408._4_4_;
  auVar355._4_4_ = local_408._4_4_;
  auVar355._0_4_ = fVar192;
  auVar355._8_4_ = fVar316;
  auVar355._12_4_ = fVar306;
  fVar383 = (fVar304 + fVar192) * 0.5;
  fVar396 = ((float)local_408._0_4_ + (float)local_408._4_4_) * 0.5;
  fVar413 = (fVar192 + fVar316) * 0.0;
  fVar417 = ((float)local_408._4_4_ + fVar306) * 0.0;
  fVar259 = local_88 * fVar383 + (float)local_348;
  fVar309 = fStack_84 * fVar383 + local_348._4_4_;
  fVar339 = fStack_80 * fVar383 + (float)uStack_340;
  fVar347 = fStack_7c * fVar383 + uStack_340._4_4_;
  fVar356 = local_98 * fVar383 + (float)local_358._0_4_;
  fVar368 = fStack_94 * fVar383 + stack0xfffffffffffffcac;
  fVar369 = fStack_90 * fVar383 + fStack_350;
  fVar380 = fStack_8c * fVar383 + fStack_34c;
  fVar259 = (fVar356 - fVar259) * fVar383 + fVar259;
  fVar309 = (fVar368 - fVar309) * fVar383 + fVar309;
  fVar339 = (fVar369 - fVar339) * fVar383 + fVar339;
  fVar347 = (fVar380 - fVar347) * fVar383 + fVar347;
  fVar356 = (((local_a8 * fVar383 + (float)local_2a8) - fVar356) * fVar383 + fVar356) - fVar259;
  fVar368 = (((fStack_a4 * fVar383 + local_2a8._4_4_) - fVar368) * fVar383 + fVar368) - fVar309;
  fVar369 = (((fStack_a0 * fVar383 + fStack_2a0) - fVar369) * fVar383 + fVar369) - fVar339;
  fVar380 = (((fStack_9c * fVar383 + fStack_29c) - fVar380) * fVar383 + fVar380) - fVar347;
  fVar259 = fVar383 * fVar356 + fVar259;
  fVar309 = fVar383 * fVar368 + fVar309;
  fVar356 = fVar356 * 3.0;
  fVar368 = fVar368 * 3.0;
  fVar339 = (fVar383 * fVar369 + fVar339) - fVar259;
  fVar347 = (fVar383 * fVar380 + fVar347) - fVar309;
  fVar356 = (fVar369 * 3.0 - fVar356) * fVar396 + fVar356;
  fVar368 = (fVar380 * 3.0 - fVar368) * fVar396 + fVar368;
  auVar250._0_8_ = CONCAT44(fVar356,fVar339) ^ 0x80000000;
  auVar250._8_4_ = fVar356;
  auVar250._12_4_ = fVar356;
  fVar449 = fVar304 - fVar383;
  fVar209 = (float)local_408._0_4_ - fVar396;
  fVar210 = fVar192 - fVar413;
  fVar211 = (float)local_408._4_4_ - fVar417;
  fVar213 = fVar192 - fVar383;
  fVar406 = (float)local_408._4_4_ - fVar396;
  fVar316 = fVar316 - fVar413;
  fVar306 = fVar306 - fVar417;
  fVar259 = fVar339 * fVar396 + fVar259;
  fVar309 = fVar347 * fVar396 + fVar309;
  auVar303._0_8_ = CONCAT44(fVar368,fVar347) ^ 0x8000000000000000;
  auVar303._8_4_ = -fVar368;
  auVar303._12_4_ = -fVar368;
  auVar177._0_4_ = fVar347 * fVar356 - fVar368 * fVar339;
  auVar177._4_4_ = auVar177._0_4_;
  auVar177._8_4_ = auVar177._0_4_;
  auVar177._12_4_ = auVar177._0_4_;
  auVar158 = divps(auVar303,auVar177);
  auVar293 = divps(auVar250,auVar177);
  fVar413 = auVar158._0_4_;
  fVar417 = auVar158._4_4_;
  fVar369 = auVar293._0_4_;
  fVar380 = auVar293._4_4_;
  fVar383 = fVar383 - (fVar309 * fVar369 + fVar259 * fVar413);
  fVar356 = fVar396 - (fVar309 * fVar380 + fVar259 * fVar417);
  fVar368 = fVar396 - (fVar309 * auVar293._8_4_ + fVar259 * auVar158._8_4_);
  fVar396 = fVar396 - (fVar309 * auVar293._12_4_ + fVar259 * auVar158._12_4_);
  auVar205._0_8_ = CONCAT44(fVar417 * fVar446,fVar417 * fVar437);
  auVar205._8_4_ = fVar417 * fVar438;
  auVar205._12_4_ = fVar417 * fVar447;
  auVar178._0_4_ = fVar417 * fVar428;
  auVar178._4_4_ = fVar417 * fVar435;
  auVar178._8_4_ = fVar417 * fVar423;
  auVar178._12_4_ = fVar417 * fVar429;
  auVar445._8_4_ = auVar205._8_4_;
  auVar445._0_8_ = auVar205._0_8_;
  auVar445._12_4_ = auVar205._12_4_;
  auVar232 = minps(auVar445,auVar178);
  auVar293 = maxps(auVar178,auVar205);
  auVar334._0_8_ = CONCAT44(fVar380 * fVar447,fVar380 * fVar438);
  auVar334._8_4_ = fVar380 * fVar439;
  auVar334._12_4_ = fVar380 * fVar448;
  auVar206._0_4_ = fVar380 * fVar423;
  auVar206._4_4_ = fVar380 * fVar429;
  auVar206._8_4_ = fVar380 * fVar425;
  auVar206._12_4_ = fVar380 * fVar258;
  auVar393._8_4_ = auVar334._8_4_;
  auVar393._0_8_ = auVar334._0_8_;
  auVar393._12_4_ = auVar334._12_4_;
  auVar230 = minps(auVar393,auVar206);
  auVar158 = maxps(auVar206,auVar334);
  fVar259 = 0.0 - (auVar158._0_4_ + auVar293._0_4_);
  fVar309 = 1.0 - (auVar158._4_4_ + auVar293._4_4_);
  fVar339 = 0.0 - (auVar158._8_4_ + auVar293._8_4_);
  fVar347 = 0.0 - (auVar158._12_4_ + auVar293._12_4_);
  fVar434 = 0.0 - (auVar230._0_4_ + auVar232._0_4_);
  fVar253 = 1.0 - (auVar230._4_4_ + auVar232._4_4_);
  fVar255 = 0.0 - (auVar230._8_4_ + auVar232._8_4_);
  fVar443 = 0.0 - (auVar230._12_4_ + auVar232._12_4_);
  auVar207._0_8_ = CONCAT44(fVar209 * fVar309,fVar449 * fVar259);
  auVar207._8_4_ = fVar210 * fVar339;
  auVar207._12_4_ = fVar211 * fVar347;
  auVar410._0_8_ = CONCAT44(fVar446 * fVar413,fVar437 * fVar413);
  auVar410._8_4_ = fVar438 * fVar413;
  auVar410._12_4_ = fVar447 * fVar413;
  auVar335._0_4_ = fVar413 * fVar428;
  auVar335._4_4_ = fVar413 * fVar435;
  auVar335._8_4_ = fVar413 * fVar423;
  auVar335._12_4_ = fVar413 * fVar429;
  auVar394._8_4_ = auVar410._8_4_;
  auVar394._0_8_ = auVar410._0_8_;
  auVar394._12_4_ = auVar410._12_4_;
  auVar158 = minps(auVar394,auVar335);
  auVar293 = maxps(auVar335,auVar410);
  auVar364._0_8_ = CONCAT44(fVar447 * fVar369,fVar438 * fVar369);
  auVar364._8_4_ = fVar439 * fVar369;
  auVar364._12_4_ = fVar448 * fVar369;
  auVar411._0_4_ = fVar369 * fVar423;
  auVar411._4_4_ = fVar369 * fVar429;
  auVar411._8_4_ = fVar369 * fVar425;
  auVar411._12_4_ = fVar369 * fVar258;
  auVar442._8_4_ = auVar364._8_4_;
  auVar442._0_8_ = auVar364._0_8_;
  auVar442._12_4_ = auVar364._12_4_;
  auVar232 = minps(auVar442,auVar411);
  auVar395._0_4_ = fVar449 * fVar434;
  auVar395._4_4_ = fVar209 * fVar253;
  auVar395._8_4_ = fVar210 * fVar255;
  auVar395._12_4_ = fVar211 * fVar443;
  auVar179._0_8_ = CONCAT44(fVar309 * fVar406,fVar259 * fVar213);
  auVar179._8_4_ = fVar339 * fVar316;
  auVar179._12_4_ = fVar347 * fVar306;
  auVar346._0_4_ = fVar434 * fVar213;
  auVar346._4_4_ = fVar253 * fVar406;
  auVar346._8_4_ = fVar255 * fVar316;
  auVar346._12_4_ = fVar443 * fVar306;
  auVar230 = maxps(auVar411,auVar364);
  fVar258 = 1.0 - (auVar230._0_4_ + auVar293._0_4_);
  fVar259 = 0.0 - (auVar230._4_4_ + auVar293._4_4_);
  fVar309 = 0.0 - (auVar230._8_4_ + auVar293._8_4_);
  fVar339 = 0.0 - (auVar230._12_4_ + auVar293._12_4_);
  fVar347 = 1.0 - (auVar232._0_4_ + auVar158._0_4_);
  fVar428 = 0.0 - (auVar232._4_4_ + auVar158._4_4_);
  fVar434 = 0.0 - (auVar232._8_4_ + auVar158._8_4_);
  fVar423 = 0.0 - (auVar232._12_4_ + auVar158._12_4_);
  auVar365._0_8_ = CONCAT44(fVar209 * fVar259,fVar449 * fVar258);
  auVar365._8_4_ = fVar210 * fVar309;
  auVar365._12_4_ = fVar211 * fVar339;
  auVar422._0_4_ = fVar449 * fVar347;
  auVar422._4_4_ = fVar209 * fVar428;
  auVar422._8_4_ = fVar210 * fVar434;
  auVar422._12_4_ = fVar211 * fVar423;
  auVar336._0_8_ = CONCAT44(fVar259 * fVar406,fVar258 * fVar213);
  auVar336._8_4_ = fVar309 * fVar316;
  auVar336._12_4_ = fVar339 * fVar306;
  auVar379._0_4_ = fVar347 * fVar213;
  auVar379._4_4_ = fVar428 * fVar406;
  auVar379._8_4_ = fVar434 * fVar316;
  auVar379._12_4_ = fVar423 * fVar306;
  auVar412._8_4_ = auVar365._8_4_;
  auVar412._0_8_ = auVar365._0_8_;
  auVar412._12_4_ = auVar365._12_4_;
  auVar293 = minps(auVar412,auVar422);
  auVar433._8_4_ = auVar336._8_4_;
  auVar433._0_8_ = auVar336._0_8_;
  auVar433._12_4_ = auVar336._12_4_;
  auVar158 = minps(auVar433,auVar379);
  auVar374 = minps(auVar293,auVar158);
  auVar430._0_12_ = ZEXT812(0x3f800000);
  auVar430._12_4_ = 0.0;
  auVar158 = maxps(auVar422,auVar365);
  auVar293 = maxps(auVar379,auVar336);
  auVar230 = maxps(auVar293,auVar158);
  auVar366._8_4_ = auVar207._8_4_;
  auVar366._0_8_ = auVar207._0_8_;
  auVar366._12_4_ = auVar207._12_4_;
  auVar158 = minps(auVar366,auVar395);
  auVar337._8_4_ = auVar179._8_4_;
  auVar337._0_8_ = auVar179._0_8_;
  auVar337._12_4_ = auVar179._12_4_;
  auVar293 = minps(auVar337,auVar346);
  auVar158 = minps(auVar158,auVar293);
  auVar232 = maxps(auVar395,auVar207);
  auVar293 = maxps(auVar346,auVar179);
  auVar293 = maxps(auVar293,auVar232);
  auVar367._0_4_ = auVar374._4_4_ + auVar374._0_4_ + fVar383;
  auVar367._4_4_ = auVar158._4_4_ + auVar158._0_4_ + fVar356;
  auVar367._8_4_ = auVar374._8_4_ + auVar374._4_4_ + fVar368;
  auVar367._12_4_ = auVar374._12_4_ + auVar158._4_4_ + fVar396;
  fVar258 = auVar230._4_4_ + auVar230._0_4_ + fVar383;
  fVar306 = auVar293._4_4_ + auVar293._0_4_ + fVar356;
  auVar180._4_4_ = fVar306;
  auVar180._0_4_ = fVar258;
  auVar203 = maxps(_local_3f8,auVar367);
  auVar180._8_4_ = auVar230._8_4_ + auVar230._4_4_ + fVar368;
  auVar180._12_4_ = auVar230._12_4_ + auVar293._4_4_ + fVar396;
  auVar293 = minps(auVar180,auVar355);
  iVar143 = -(uint)(auVar293._0_4_ < auVar203._0_4_);
  iVar188 = -(uint)(auVar293._4_4_ < auVar203._4_4_);
  auVar181._4_4_ = iVar188;
  auVar181._0_4_ = iVar143;
  auVar181._8_4_ = iVar188;
  auVar181._12_4_ = iVar188;
  auVar175._8_8_ = auVar181._8_8_;
  auVar175._4_4_ = (float)iVar143;
  auVar175._0_4_ = (float)iVar143;
  iVar143 = movmskpd((uint)(fVar338 < 0.0),auVar175);
  auVar172 = _local_3f8;
  if (iVar143 != 0) goto LAB_0038f2b6;
  bVar128 = 0;
  if ((fVar304 < auVar367._0_4_) && (fVar258 < fVar192)) {
    bVar128 = -(fVar306 < (float)local_408._4_4_) & (float)local_408._0_4_ < auVar367._4_4_;
  }
  bVar128 = bVar136 | bVar128;
  uVar130 = (ulong)CONCAT31(uVar34,bVar128);
  if (bVar128 != 1) goto LAB_0038ec55;
  uVar130 = 0xc9;
  do {
    uVar130 = uVar130 - 1;
    if (uVar130 == 0) goto LAB_0038f2b6;
    fVar257 = 1.0 - fVar383;
    fVar306 = fVar383 * fVar383 * fVar383;
    fVar258 = fVar383 * fVar383 * 3.0 * fVar257;
    fVar436 = fVar257 * fVar257 * fVar257;
    fVar316 = fVar383 * 3.0 * fVar257 * fVar257;
    fVar257 = fVar436 * (float)local_348 +
              fVar316 * (float)local_358._0_4_ +
              fVar258 * (float)local_2a8 + fVar306 * local_b8._0_4_;
    fVar304 = fVar436 * local_348._4_4_ +
              fVar316 * stack0xfffffffffffffcac +
              fVar258 * local_2a8._4_4_ + fVar306 * local_b8._4_4_;
    fVar192 = fVar436 * (float)uStack_340 +
              fVar316 * fStack_350 + fVar258 * fStack_2a0 + fVar306 * local_b8._8_4_;
    fVar258 = fVar436 * uStack_340._4_4_ +
              fVar316 * fStack_34c + fVar258 * fStack_29c + fVar306 * local_b8._12_4_;
    fVar306 = (fVar192 - fVar257) * fVar356;
    fVar316 = (fVar258 - fVar304) * fVar356;
    fVar436 = (fVar192 - fVar257) * fVar356 + fVar257;
    fVar192 = (fVar258 - fVar304) * fVar356 + fVar304;
    fVar383 = fVar383 - (fVar192 * fVar369 + fVar436 * fVar413);
    fVar356 = fVar356 - (fVar192 * fVar380 + fVar436 * fVar417);
    fVar258 = ABS(fVar192);
    auVar175._0_8_ = CONCAT44(fVar192,fVar436) & 0x7fffffff7fffffff;
    auVar175._8_4_ = ABS(fVar306 + fVar257);
    auVar175._12_4_ = ABS(fVar316 + fVar304);
    auVar203._0_8_ = CONCAT44(fVar192,fVar192) & 0x7fffffff7fffffff;
    auVar203._8_4_ = fVar258;
    auVar203._12_4_ = fVar258;
    if (fVar258 <= ABS(fVar436)) {
      auVar203._0_4_ = ABS(fVar436);
    }
  } while (local_c8 <= auVar203._0_4_);
  if ((((fVar383 < 0.0) || (1.0 < fVar383)) ||
      (auVar203._4_4_ = fVar356, auVar203._0_4_ = fVar356, auVar203._8_4_ = fVar356,
      auVar203._12_4_ = fVar356, fVar356 < 0.0)) || (1.0 < fVar356)) goto LAB_0038f2b6;
  fVar436 = (pre->ray_space).vx.field_0.m128[2];
  fVar257 = (pre->ray_space).vy.field_0.m128[2];
  fVar304 = (pre->ray_space).vz.field_0.m128[2];
  fVar192 = (ray->org).field_0.m128[0];
  fVar258 = (ray->org).field_0.m128[1];
  fVar306 = (ray->org).field_0.m128[2];
  fVar316 = (ray->org).field_0.m128[3];
  auVar182._0_4_ = (local_388 - fVar192) * fVar436;
  auVar182._4_4_ = (fStack_384 - fVar258) * fVar257;
  auVar182._8_4_ = (fStack_380 - fVar306) * fVar304;
  auVar182._12_4_ = (fStack_37c - fVar316) * 0.0;
  auVar183._8_8_ = auVar182._8_8_;
  auVar183._0_8_ = auVar183._8_8_;
  auVar175._4_12_ = auVar183._4_12_;
  fVar339 = 1.0 - fVar356;
  fVar338 = 1.0 - fVar383;
  fVar259 = fVar338 * fVar338 * fVar338;
  fVar309 = fVar383 * 3.0 * fVar338 * fVar338;
  fVar313 = fVar383 * fVar383 * fVar383;
  fVar310 = fVar383 * fVar383 * 3.0 * fVar338;
  auVar175._0_4_ =
       ((auVar182._8_4_ + auVar182._4_4_ + auVar182._0_4_) * fVar339 +
       ((fStack_370 - fVar306) * fVar304 +
       (fStack_374 - fVar258) * fVar257 + (local_378 - fVar192) * fVar436) * fVar356) * fVar259 +
       (((fStack_390 - fVar306) * fVar304 +
        (fStack_394 - fVar258) * fVar257 + (local_398 - fVar192) * fVar436) * fVar339 +
       ((fStack_360 - fVar306) * fVar304 +
       (fStack_364 - fVar258) * fVar257 + (local_368 - fVar192) * fVar436) * fVar356) * fVar309 +
       (((fStack_3b0 - fVar306) * fVar304 +
        (fStack_3b4 - fVar258) * fVar257 + (local_3b8 - fVar192) * fVar436) * fVar339 +
       ((fStack_3c0 - fVar306) * fVar304 +
       (fStack_3c4 - fVar258) * fVar257 + (local_3c8 - fVar192) * fVar436) * fVar356) * fVar310 +
       (fVar339 * ((fStack_3a0 - fVar306) * fVar304 +
                  (fStack_3a4 - fVar258) * fVar257 + (local_3a8 - fVar192) * fVar436) +
       ((fStack_210 - fVar306) * fVar304 +
       (fStack_214 - fVar258) * fVar257 + (local_218 - fVar192) * fVar436) * fVar356) * fVar313;
  if (auVar175._0_4_ < fVar316) goto LAB_0038f2b6;
  fVar436 = ray->tfar;
  auVar430 = ZEXT416((uint)fVar436);
  if (fVar436 < auVar175._0_4_) goto LAB_0038f2b6;
  fVar306 = 1.0 - fVar356;
  fVar316 = 1.0 - fVar356;
  fVar339 = 1.0 - fVar356;
  fVar347 = 1.0 - fVar356;
  fVar257 = local_398 * fVar306 + local_368 * fVar356;
  fVar304 = fStack_394 * fVar316 + fStack_364 * fVar356;
  fVar192 = fStack_390 * fVar339 + fStack_360 * fVar356;
  fVar258 = fStack_38c * fVar347 + fStack_35c * fVar356;
  fVar368 = local_3b8 * fVar306 + local_3c8 * fVar356;
  fVar380 = fStack_3b4 * fVar316 + fStack_3c4 * fVar356;
  fVar413 = fStack_3b0 * fVar339 + fStack_3c0 * fVar356;
  fVar428 = fStack_3ac * fVar347 + fStack_3bc * fVar356;
  fVar369 = fVar368 - fVar257;
  fVar396 = fVar380 - fVar304;
  fVar417 = fVar413 - fVar192;
  fVar434 = fVar428 - fVar258;
  auVar203._4_4_ = fVar383;
  auVar203._0_4_ = fVar383;
  auVar203._8_4_ = fVar383;
  auVar203._12_4_ = fVar383;
  fVar257 = (((fVar257 - (local_388 * fVar306 + local_378 * fVar356)) * fVar338 + fVar383 * fVar369)
             * fVar338 +
            (fVar369 * fVar338 + ((fVar306 * local_3a8 + fVar356 * local_218) - fVar368) * fVar383)
            * fVar383) * 3.0;
  fVar304 = (((fVar304 - (fStack_384 * fVar316 + fStack_374 * fVar356)) * fVar338 +
             fVar383 * fVar396) * fVar338 +
            (fVar396 * fVar338 + ((fVar316 * fStack_3a4 + fVar356 * fStack_214) - fVar380) * fVar383
            ) * fVar383) * 3.0;
  fVar192 = (((fVar192 - (fStack_380 * fVar339 + fStack_370 * fVar356)) * fVar338 +
             fVar383 * fVar417) * fVar338 +
            (fVar417 * fVar338 + ((fVar339 * fStack_3a0 + fVar356 * fStack_210) - fVar413) * fVar383
            ) * fVar383) * 3.0;
  fVar258 = (((fVar258 - (fStack_37c * fVar347 + fStack_36c * fVar356)) * fVar338 +
             fVar383 * fVar434) * fVar338 +
            (fVar434 * fVar338 + ((fVar347 * fStack_39c + fVar356 * fStack_20c) - fVar428) * fVar383
            ) * fVar383) * 3.0;
  pGVar21 = (context->scene->geometries).items[uVar138].ptr;
  if ((pGVar21->mask & ray->mask) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (uVar130 = CONCAT71((int7)((ulong)context->args >> 8),1),
       pGVar21->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_003902b3;
    fVar306 = fVar259 * local_198 + fVar309 * local_1a8 + fVar310 * local_1b8 + fVar313 * local_1c8;
    fVar316 = fVar259 * fStack_194 +
              fVar309 * fStack_1a4 + fVar310 * fStack_1b4 + fVar313 * fStack_1c4;
    fVar338 = fVar259 * fStack_190 +
              fVar309 * fStack_1a0 + fVar310 * fStack_1b0 + fVar313 * fStack_1c0;
    fVar259 = fVar259 * fStack_18c +
              fVar309 * fStack_19c + fVar310 * fStack_1ac + fVar313 * fStack_1bc;
    auVar203._0_4_ = fVar316 * fVar257 - fVar304 * fVar306;
    auVar203._4_4_ = fVar338 * fVar304 - fVar192 * fVar316;
    auVar203._8_4_ = fVar306 * fVar192 - fVar257 * fVar338;
    auVar203._12_4_ = fVar259 * fVar258 - fVar258 * fVar259;
    local_1f8 = CONCAT44(auVar203._8_4_,auVar203._4_4_);
    local_1f0 = auVar203._0_4_;
    local_1ec = fVar383;
    fStack_1e8 = fVar356;
    local_1e4 = (int)_local_298;
    local_1e0 = uVar138;
    local_1dc = context->user->instID[0];
    local_1d8 = context->user->instPrimID[0];
    ray->tfar = auVar175._0_4_;
    local_3cc = 0xffffffff;
    local_288.valid = &local_3cc;
    local_288.geometryUserPtr = pGVar21->userPtr;
    local_288.context = context->user;
    local_288.hit = (RTCHitN *)&local_1f8;
    local_288.N = 1;
    local_288.ray = (RTCRayN *)ray;
    if (pGVar21->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00390266:
      p_Var131 = context->args->filter;
      if ((p_Var131 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar21->field_8).field_0x2 & 0x40) != 0)))) {
        auVar293 = (*p_Var131)(&local_288);
        auVar203._0_8_ = auVar293._8_8_;
        auVar175._0_8_ = auVar293._0_8_;
        auVar203._8_8_ = extraout_XMM1_Qb_00;
        auVar175._8_8_ = extraout_XMM0_Qb_00;
        p_Var131 = (RTCFilterFunctionN)local_288.valid;
        if (*local_288.valid == 0) goto LAB_003902a5;
      }
      uVar130 = CONCAT71((int7)((ulong)p_Var131 >> 8),1);
      goto LAB_003902b3;
    }
    auVar293 = (*pGVar21->occlusionFilterN)(&local_288);
    auVar203._0_8_ = auVar293._8_8_;
    auVar175._0_8_ = auVar293._0_8_;
    auVar203._8_8_ = extraout_XMM1_Qb;
    auVar175._8_8_ = extraout_XMM0_Qb;
    if (*local_288.valid != 0) goto LAB_00390266;
LAB_003902a5:
    auVar175 = ZEXT416((uint)fVar436);
    ray->tfar = fVar436;
  }
  uVar130 = 0;
LAB_003902b3:
  bVar135 = bVar135 | (byte)uVar130;
  goto LAB_0038f2b6;
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }